

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx::CurveNiIntersectorK<4,4>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  RayQueryContext *pRVar51;
  uint uVar52;
  long lVar53;
  ulong uVar54;
  uint uVar55;
  uint uVar56;
  ulong uVar57;
  bool bVar58;
  ulong uVar59;
  bool bVar60;
  vint4 bi_2;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar63 [16];
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float fVar85;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar89;
  float fVar115;
  vint4 bi_1;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar90;
  float fVar116;
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar94 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  vint4 ai;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float t1;
  float fVar142;
  float fVar149;
  float fVar150;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar151;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar152;
  undefined1 auVar148 [32];
  float fVar170;
  vint4 bi;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar171;
  float fVar188;
  float fVar189;
  vint4 ai_2;
  undefined1 auVar172 [16];
  float fVar190;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar191;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar192;
  float fVar205;
  float fVar206;
  undefined1 auVar193 [16];
  float fVar207;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar204 [64];
  vfloat4 b0;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  float fVar219;
  float fVar230;
  float fVar232;
  vint4 ai_1;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar231;
  float fVar233;
  float fVar234;
  undefined1 auVar229 [32];
  float fVar235;
  float fVar251;
  float fVar252;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar249 [32];
  float fVar253;
  undefined1 auVar250 [32];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  vfloat4 a0;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  float fVar270;
  float fVar275;
  float fVar276;
  vfloat4 a0_1;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar277;
  undefined1 auVar274 [16];
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar288;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar295;
  vfloat_impl<4> p00;
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  undefined1 local_568 [8];
  float fStack_560;
  float fStack_55c;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float fStack_520;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float fStack_500;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [16];
  undefined1 (*local_488) [16];
  RayQueryContext *local_480;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [16];
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 auStack_3d8 [16];
  uint auStack_3c8 [4];
  RTCFilterFunctionNArguments local_3b8;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [32];
  float afStack_228 [8];
  RTCHitN local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar203 [32];
  undefined1 auVar294 [32];
  
  PVar4 = prim[1];
  uVar57 = (ulong)(byte)PVar4;
  auVar67 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar241 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar241 = vinsertps_avx(auVar241,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar171 = *(float *)(prim + uVar57 * 0x19 + 0x12);
  auVar67 = vsubps_avx(auVar67,*(undefined1 (*) [16])(prim + uVar57 * 0x19 + 6));
  auVar117._0_4_ = fVar171 * auVar67._0_4_;
  auVar117._4_4_ = fVar171 * auVar67._4_4_;
  auVar117._8_4_ = fVar171 * auVar67._8_4_;
  auVar117._12_4_ = fVar171 * auVar67._12_4_;
  auVar208._0_4_ = fVar171 * auVar241._0_4_;
  auVar208._4_4_ = fVar171 * auVar241._4_4_;
  auVar208._8_4_ = fVar171 * auVar241._8_4_;
  auVar208._12_4_ = fVar171 * auVar241._12_4_;
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 4 + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar241 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 5 + 6)));
  auVar241 = vcvtdq2ps_avx(auVar241);
  auVar137 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 6 + 6)));
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar57 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  uVar59 = (ulong)(uint)((int)(uVar57 * 9) * 2);
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 + uVar57 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  uVar59 = (ulong)(uint)((int)(uVar57 * 5) << 2);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 + 6)));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar61 = vshufps_avx(auVar208,auVar208,0);
  auVar91 = vshufps_avx(auVar208,auVar208,0x55);
  auVar118 = vshufps_avx(auVar208,auVar208,0xaa);
  fVar171 = auVar118._0_4_;
  fVar142 = auVar118._4_4_;
  fVar188 = auVar118._8_4_;
  fVar149 = auVar118._12_4_;
  fVar192 = auVar91._0_4_;
  fVar205 = auVar91._4_4_;
  fVar206 = auVar91._8_4_;
  fVar207 = auVar91._12_4_;
  fVar189 = auVar61._0_4_;
  fVar150 = auVar61._4_4_;
  fVar190 = auVar61._8_4_;
  fVar151 = auVar61._12_4_;
  auVar271._0_4_ = fVar189 * auVar67._0_4_ + fVar192 * auVar241._0_4_ + fVar171 * auVar137._0_4_;
  auVar271._4_4_ = fVar150 * auVar67._4_4_ + fVar205 * auVar241._4_4_ + fVar142 * auVar137._4_4_;
  auVar271._8_4_ = fVar190 * auVar67._8_4_ + fVar206 * auVar241._8_4_ + fVar188 * auVar137._8_4_;
  auVar271._12_4_ = fVar151 * auVar67._12_4_ + fVar207 * auVar241._12_4_ + fVar149 * auVar137._12_4_
  ;
  auVar282._0_4_ = fVar189 * auVar10._0_4_ + fVar192 * auVar11._0_4_ + auVar12._0_4_ * fVar171;
  auVar282._4_4_ = fVar150 * auVar10._4_4_ + fVar205 * auVar11._4_4_ + auVar12._4_4_ * fVar142;
  auVar282._8_4_ = fVar190 * auVar10._8_4_ + fVar206 * auVar11._8_4_ + auVar12._8_4_ * fVar188;
  auVar282._12_4_ = fVar151 * auVar10._12_4_ + fVar207 * auVar11._12_4_ + auVar12._12_4_ * fVar149;
  auVar209._0_4_ = fVar189 * auVar62._0_4_ + fVar192 * auVar96._0_4_ + auVar127._0_4_ * fVar171;
  auVar209._4_4_ = fVar150 * auVar62._4_4_ + fVar205 * auVar96._4_4_ + auVar127._4_4_ * fVar142;
  auVar209._8_4_ = fVar190 * auVar62._8_4_ + fVar206 * auVar96._8_4_ + auVar127._8_4_ * fVar188;
  auVar209._12_4_ = fVar151 * auVar62._12_4_ + fVar207 * auVar96._12_4_ + auVar127._12_4_ * fVar149;
  auVar61 = vshufps_avx(auVar117,auVar117,0);
  auVar91 = vshufps_avx(auVar117,auVar117,0x55);
  auVar118 = vshufps_avx(auVar117,auVar117,0xaa);
  fVar171 = auVar118._0_4_;
  fVar142 = auVar118._4_4_;
  fVar188 = auVar118._8_4_;
  fVar149 = auVar118._12_4_;
  fVar192 = auVar91._0_4_;
  fVar205 = auVar91._4_4_;
  fVar206 = auVar91._8_4_;
  fVar207 = auVar91._12_4_;
  fVar189 = auVar61._0_4_;
  fVar150 = auVar61._4_4_;
  fVar190 = auVar61._8_4_;
  fVar151 = auVar61._12_4_;
  auVar153._0_4_ = fVar189 * auVar67._0_4_ + fVar192 * auVar241._0_4_ + fVar171 * auVar137._0_4_;
  auVar153._4_4_ = fVar150 * auVar67._4_4_ + fVar205 * auVar241._4_4_ + fVar142 * auVar137._4_4_;
  auVar153._8_4_ = fVar190 * auVar67._8_4_ + fVar206 * auVar241._8_4_ + fVar188 * auVar137._8_4_;
  auVar153._12_4_ = fVar151 * auVar67._12_4_ + fVar207 * auVar241._12_4_ + fVar149 * auVar137._12_4_
  ;
  auVar91._0_4_ = fVar189 * auVar10._0_4_ + auVar12._0_4_ * fVar171 + fVar192 * auVar11._0_4_;
  auVar91._4_4_ = fVar150 * auVar10._4_4_ + auVar12._4_4_ * fVar142 + fVar205 * auVar11._4_4_;
  auVar91._8_4_ = fVar190 * auVar10._8_4_ + auVar12._8_4_ * fVar188 + fVar206 * auVar11._8_4_;
  auVar91._12_4_ = fVar151 * auVar10._12_4_ + auVar12._12_4_ * fVar149 + fVar207 * auVar11._12_4_;
  auVar61._0_4_ = fVar189 * auVar62._0_4_ + fVar192 * auVar96._0_4_ + auVar127._0_4_ * fVar171;
  auVar61._4_4_ = fVar150 * auVar62._4_4_ + fVar205 * auVar96._4_4_ + auVar127._4_4_ * fVar142;
  auVar61._8_4_ = fVar190 * auVar62._8_4_ + fVar206 * auVar96._8_4_ + auVar127._8_4_ * fVar188;
  auVar61._12_4_ = fVar151 * auVar62._12_4_ + fVar207 * auVar96._12_4_ + auVar127._12_4_ * fVar149;
  auVar193._8_4_ = 0x7fffffff;
  auVar193._0_8_ = 0x7fffffff7fffffff;
  auVar193._12_4_ = 0x7fffffff;
  auVar67 = vandps_avx(auVar271,auVar193);
  auVar143._8_4_ = 0x219392ef;
  auVar143._0_8_ = 0x219392ef219392ef;
  auVar143._12_4_ = 0x219392ef;
  auVar67 = vcmpps_avx(auVar67,auVar143,1);
  auVar241 = vblendvps_avx(auVar271,auVar143,auVar67);
  auVar67 = vandps_avx(auVar282,auVar193);
  auVar67 = vcmpps_avx(auVar67,auVar143,1);
  auVar137 = vblendvps_avx(auVar282,auVar143,auVar67);
  auVar67 = vandps_avx(auVar209,auVar193);
  auVar67 = vcmpps_avx(auVar67,auVar143,1);
  auVar67 = vblendvps_avx(auVar209,auVar143,auVar67);
  auVar10 = vrcpps_avx(auVar241);
  fVar192 = auVar10._0_4_;
  auVar118._0_4_ = fVar192 * auVar241._0_4_;
  fVar205 = auVar10._4_4_;
  auVar118._4_4_ = fVar205 * auVar241._4_4_;
  fVar206 = auVar10._8_4_;
  auVar118._8_4_ = fVar206 * auVar241._8_4_;
  fVar207 = auVar10._12_4_;
  auVar118._12_4_ = fVar207 * auVar241._12_4_;
  auVar210._8_4_ = 0x3f800000;
  auVar210._0_8_ = 0x3f8000003f800000;
  auVar210._12_4_ = 0x3f800000;
  auVar241 = vsubps_avx(auVar210,auVar118);
  fVar192 = fVar192 + fVar192 * auVar241._0_4_;
  fVar205 = fVar205 + fVar205 * auVar241._4_4_;
  fVar206 = fVar206 + fVar206 * auVar241._8_4_;
  fVar207 = fVar207 + fVar207 * auVar241._12_4_;
  auVar241 = vrcpps_avx(auVar137);
  fVar171 = auVar241._0_4_;
  auVar172._0_4_ = fVar171 * auVar137._0_4_;
  fVar188 = auVar241._4_4_;
  auVar172._4_4_ = fVar188 * auVar137._4_4_;
  fVar189 = auVar241._8_4_;
  auVar172._8_4_ = fVar189 * auVar137._8_4_;
  fVar190 = auVar241._12_4_;
  auVar172._12_4_ = fVar190 * auVar137._12_4_;
  auVar241 = vsubps_avx(auVar210,auVar172);
  fVar171 = fVar171 + fVar171 * auVar241._0_4_;
  fVar188 = fVar188 + fVar188 * auVar241._4_4_;
  fVar189 = fVar189 + fVar189 * auVar241._8_4_;
  fVar190 = fVar190 + fVar190 * auVar241._12_4_;
  auVar241 = vrcpps_avx(auVar67);
  fVar142 = auVar241._0_4_;
  auVar144._0_4_ = fVar142 * auVar67._0_4_;
  fVar149 = auVar241._4_4_;
  auVar144._4_4_ = fVar149 * auVar67._4_4_;
  fVar150 = auVar241._8_4_;
  auVar144._8_4_ = fVar150 * auVar67._8_4_;
  fVar151 = auVar241._12_4_;
  auVar144._12_4_ = fVar151 * auVar67._12_4_;
  auVar67 = vsubps_avx(auVar210,auVar144);
  fVar142 = fVar142 + fVar142 * auVar67._0_4_;
  fVar149 = fVar149 + fVar149 * auVar67._4_4_;
  fVar150 = fVar150 + fVar150 * auVar67._8_4_;
  fVar151 = fVar151 + fVar151 * auVar67._12_4_;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar57 * 7 + 6);
  auVar67 = vpmovsxwd_avx(auVar67);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar153);
  auVar119._0_4_ = fVar192 * auVar67._0_4_;
  auVar119._4_4_ = fVar205 * auVar67._4_4_;
  auVar119._8_4_ = fVar206 * auVar67._8_4_;
  auVar119._12_4_ = fVar207 * auVar67._12_4_;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = *(ulong *)(prim + uVar57 * 9 + 6);
  auVar67 = vpmovsxwd_avx(auVar241);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar153);
  auVar154._0_4_ = fVar192 * auVar67._0_4_;
  auVar154._4_4_ = fVar205 * auVar67._4_4_;
  auVar154._8_4_ = fVar206 * auVar67._8_4_;
  auVar154._12_4_ = fVar207 * auVar67._12_4_;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar241 = vpmovsxwd_avx(auVar137);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar57 * -2 + 6);
  auVar67 = vpmovsxwd_avx(auVar10);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar91);
  auVar220._0_4_ = auVar67._0_4_ * fVar171;
  auVar220._4_4_ = auVar67._4_4_ * fVar188;
  auVar220._8_4_ = auVar67._8_4_ * fVar189;
  auVar220._12_4_ = auVar67._12_4_ * fVar190;
  auVar67 = vcvtdq2ps_avx(auVar241);
  auVar67 = vsubps_avx(auVar67,auVar91);
  auVar127._0_4_ = fVar171 * auVar67._0_4_;
  auVar127._4_4_ = fVar188 * auVar67._4_4_;
  auVar127._8_4_ = fVar189 * auVar67._8_4_;
  auVar127._12_4_ = fVar190 * auVar67._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar59 + uVar57 + 6);
  auVar67 = vpmovsxwd_avx(auVar11);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar61);
  auVar173._0_4_ = auVar67._0_4_ * fVar142;
  auVar173._4_4_ = auVar67._4_4_ * fVar149;
  auVar173._8_4_ = auVar67._8_4_ * fVar150;
  auVar173._12_4_ = auVar67._12_4_ * fVar151;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar57 * 0x17 + 6);
  auVar67 = vpmovsxwd_avx(auVar12);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar61);
  auVar62._0_4_ = auVar67._0_4_ * fVar142;
  auVar62._4_4_ = auVar67._4_4_ * fVar149;
  auVar62._8_4_ = auVar67._8_4_ * fVar150;
  auVar62._12_4_ = auVar67._12_4_ * fVar151;
  auVar67 = vpminsd_avx(auVar119,auVar154);
  auVar241 = vpminsd_avx(auVar220,auVar127);
  auVar67 = vmaxps_avx(auVar67,auVar241);
  auVar241 = vpminsd_avx(auVar173,auVar62);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar236._4_4_ = uVar2;
  auVar236._0_4_ = uVar2;
  auVar236._8_4_ = uVar2;
  auVar236._12_4_ = uVar2;
  auVar241 = vmaxps_avx(auVar241,auVar236);
  auVar67 = vmaxps_avx(auVar67,auVar241);
  local_318._0_4_ = auVar67._0_4_ * 0.99999964;
  local_318._4_4_ = auVar67._4_4_ * 0.99999964;
  local_318._8_4_ = auVar67._8_4_ * 0.99999964;
  local_318._12_4_ = auVar67._12_4_ * 0.99999964;
  auVar67 = vpmaxsd_avx(auVar119,auVar154);
  auVar241 = vpmaxsd_avx(auVar220,auVar127);
  auVar67 = vminps_avx(auVar67,auVar241);
  auVar241 = vpmaxsd_avx(auVar173,auVar62);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar120._4_4_ = uVar2;
  auVar120._0_4_ = uVar2;
  auVar120._8_4_ = uVar2;
  auVar120._12_4_ = uVar2;
  auVar241 = vminps_avx(auVar241,auVar120);
  auVar67 = vminps_avx(auVar67,auVar241);
  auVar96._0_4_ = auVar67._0_4_ * 1.0000004;
  auVar96._4_4_ = auVar67._4_4_ * 1.0000004;
  auVar96._8_4_ = auVar67._8_4_ * 1.0000004;
  auVar96._12_4_ = auVar67._12_4_ * 1.0000004;
  auVar67 = vpshufd_avx(ZEXT116((byte)PVar4),0);
  auVar241 = vpcmpgtd_avx(auVar67,_DAT_01f7fcf0);
  auVar67 = vcmpps_avx(local_318,auVar96,2);
  auVar67 = vandps_avx(auVar67,auVar241);
  uVar52 = vmovmskps_avx(auVar67);
  if (uVar52 == 0) {
    return false;
  }
  uVar52 = uVar52 & 0xff;
  auVar79._16_16_ = mm_lookupmask_ps._240_16_;
  auVar79._0_16_ = mm_lookupmask_ps._240_16_;
  local_178 = vblendps_avx(auVar79,ZEXT832(0) << 0x20,0x80);
  local_488 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_480 = context;
LAB_00e3a87c:
  pRVar51 = local_480;
  uVar59 = (ulong)uVar52;
  lVar53 = 0;
  if (uVar59 != 0) {
    for (; (uVar52 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
    }
  }
  uVar52 = *(uint *)(prim + 2);
  uVar55 = *(uint *)(prim + lVar53 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar52].ptr;
  uVar57 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar55);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar67 = *(undefined1 (*) [16])(_Var8 + uVar57 * (long)pvVar7);
  pfVar1 = (float *)(_Var8 + (uVar57 + 1) * (long)pvVar7);
  fVar171 = *pfVar1;
  fVar142 = pfVar1[1];
  fVar188 = pfVar1[2];
  fVar149 = pfVar1[3];
  pfVar1 = (float *)(_Var8 + (uVar57 + 2) * (long)pvVar7);
  fVar189 = *pfVar1;
  fVar150 = pfVar1[1];
  fVar190 = pfVar1[2];
  fVar151 = pfVar1[3];
  pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar57 + 3));
  fVar192 = *pfVar1;
  fVar205 = pfVar1[1];
  fVar206 = pfVar1[2];
  fVar207 = pfVar1[3];
  uVar59 = uVar59 - 1 & uVar59;
  lVar53 = *(long *)&pGVar5[1].time_range.upper;
  pfVar1 = (float *)(lVar53 + (long)p_Var6 * uVar57);
  fVar89 = *pfVar1;
  fVar90 = pfVar1[1];
  fVar115 = pfVar1[2];
  fVar116 = pfVar1[3];
  pfVar1 = (float *)(lVar53 + (long)p_Var6 * (uVar57 + 1));
  fVar85 = *pfVar1;
  fVar86 = pfVar1[1];
  fVar87 = pfVar1[2];
  fVar88 = pfVar1[3];
  pfVar1 = (float *)(lVar53 + (long)p_Var6 * (uVar57 + 2));
  fVar152 = *pfVar1;
  fVar191 = pfVar1[1];
  fVar170 = pfVar1[2];
  fVar219 = pfVar1[3];
  lVar9 = 0;
  if (uVar59 != 0) {
    for (; (uVar59 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  pfVar1 = (float *)(lVar53 + (long)p_Var6 * (uVar57 + 3));
  fVar230 = *pfVar1;
  fVar231 = pfVar1[1];
  fVar270 = pfVar1[2];
  fVar232 = pfVar1[3];
  if (((uVar59 != 0) && (uVar57 = uVar59 - 1 & uVar59, uVar57 != 0)) && (lVar53 = 0, uVar57 != 0)) {
    for (; (uVar57 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
    }
  }
  auVar241 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar137 = vinsertps_avx(auVar241,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_538._0_4_ = fVar89 * 0.16666667 + fVar85 * 0.6666667 + fVar152 * 0.16666667 + fVar230 * 0.0;
  local_538._4_4_ = fVar90 * 0.16666667 + fVar86 * 0.6666667 + fVar191 * 0.16666667 + fVar231 * 0.0;
  fStack_530 = fVar115 * 0.16666667 + fVar87 * 0.6666667 + fVar170 * 0.16666667 + fVar270 * 0.0;
  fStack_52c = fVar116 * 0.16666667 + fVar88 * 0.6666667 + fVar219 * 0.16666667 + fVar232 * 0.0;
  auVar121._0_4_ = fVar152 * 0.5 + fVar230 * 0.0;
  auVar121._4_4_ = fVar191 * 0.5 + fVar231 * 0.0;
  auVar121._8_4_ = fVar170 * 0.5 + fVar270 * 0.0;
  auVar121._12_4_ = fVar219 * 0.5 + fVar232 * 0.0;
  auVar262._0_4_ = fVar85 * 0.0;
  auVar262._4_4_ = fVar86 * 0.0;
  auVar262._8_4_ = fVar87 * 0.0;
  auVar262._12_4_ = fVar88 * 0.0;
  auVar241 = vsubps_avx(auVar121,auVar262);
  auVar263._0_4_ = fVar89 * 0.5;
  auVar263._4_4_ = fVar90 * 0.5;
  auVar263._8_4_ = fVar115 * 0.5;
  auVar263._12_4_ = fVar116 * 0.5;
  auVar127 = vsubps_avx(auVar241,auVar263);
  fVar275 = auVar67._0_4_;
  fVar233 = auVar67._4_4_;
  fVar276 = auVar67._8_4_;
  fVar234 = auVar67._12_4_;
  auVar264._0_4_ = fVar275 * 0.16666667 + fVar171 * 0.6666667 + fVar189 * 0.16666667 + fVar192 * 0.0
  ;
  auVar264._4_4_ = fVar233 * 0.16666667 + fVar142 * 0.6666667 + fVar150 * 0.16666667 + fVar205 * 0.0
  ;
  auVar264._8_4_ = fVar276 * 0.16666667 + fVar188 * 0.6666667 + fVar190 * 0.16666667 + fVar206 * 0.0
  ;
  auVar264._12_4_ =
       fVar234 * 0.16666667 + fVar149 * 0.6666667 + fVar151 * 0.16666667 + fVar207 * 0.0;
  auVar272._0_4_ = fVar189 * 0.5 + fVar192 * 0.0;
  auVar272._4_4_ = fVar150 * 0.5 + fVar205 * 0.0;
  auVar272._8_4_ = fVar190 * 0.5 + fVar206 * 0.0;
  auVar272._12_4_ = fVar151 * 0.5 + fVar207 * 0.0;
  auVar283._0_4_ = fVar171 * 0.0;
  auVar283._4_4_ = fVar142 * 0.0;
  auVar283._8_4_ = fVar188 * 0.0;
  auVar283._12_4_ = fVar149 * 0.0;
  auVar67 = vsubps_avx(auVar272,auVar283);
  auVar284._0_4_ = fVar275 * 0.5;
  auVar284._4_4_ = fVar233 * 0.5;
  auVar284._8_4_ = fVar276 * 0.5;
  auVar284._12_4_ = fVar234 * 0.5;
  auVar11 = vsubps_avx(auVar67,auVar284);
  auVar289._0_4_ = fVar89 * 0.0;
  auVar289._4_4_ = fVar90 * 0.0;
  auVar289._8_4_ = fVar115 * 0.0;
  auVar289._12_4_ = fVar116 * 0.0;
  local_578._0_4_ =
       auVar289._0_4_ + fVar85 * 0.16666667 + fVar152 * 0.6666667 + fVar230 * 0.16666667;
  local_578._4_4_ =
       auVar289._4_4_ + fVar86 * 0.16666667 + fVar191 * 0.6666667 + fVar231 * 0.16666667;
  fStack_570 = auVar289._8_4_ + fVar87 * 0.16666667 + fVar170 * 0.6666667 + fVar270 * 0.16666667;
  fStack_56c = auVar289._12_4_ + fVar88 * 0.16666667 + fVar219 * 0.6666667 + fVar232 * 0.16666667;
  auVar237._0_4_ = fVar152 * 0.0 + fVar230 * 0.5;
  auVar237._4_4_ = fVar191 * 0.0 + fVar231 * 0.5;
  auVar237._8_4_ = fVar170 * 0.0 + fVar270 * 0.5;
  auVar237._12_4_ = fVar219 * 0.0 + fVar232 * 0.5;
  auVar155._0_4_ = fVar85 * 0.5;
  auVar155._4_4_ = fVar86 * 0.5;
  auVar155._8_4_ = fVar87 * 0.5;
  auVar155._12_4_ = fVar88 * 0.5;
  auVar67 = vsubps_avx(auVar237,auVar155);
  auVar61 = vsubps_avx(auVar67,auVar289);
  auVar194._0_4_ = fVar275 * 0.0;
  auVar194._4_4_ = fVar233 * 0.0;
  auVar194._8_4_ = fVar276 * 0.0;
  auVar194._12_4_ = fVar234 * 0.0;
  auVar238._0_4_ =
       fVar171 * 0.16666667 + fVar189 * 0.6666667 + fVar192 * 0.16666667 + auVar194._0_4_;
  auVar238._4_4_ =
       fVar142 * 0.16666667 + fVar150 * 0.6666667 + fVar205 * 0.16666667 + auVar194._4_4_;
  auVar238._8_4_ =
       fVar188 * 0.16666667 + fVar190 * 0.6666667 + fVar206 * 0.16666667 + auVar194._8_4_;
  auVar238._12_4_ =
       fVar149 * 0.16666667 + fVar151 * 0.6666667 + fVar207 * 0.16666667 + auVar194._12_4_;
  auVar211._0_4_ = fVar192 * 0.5 + fVar189 * 0.0;
  auVar211._4_4_ = fVar205 * 0.5 + fVar150 * 0.0;
  auVar211._8_4_ = fVar206 * 0.5 + fVar190 * 0.0;
  auVar211._12_4_ = fVar207 * 0.5 + fVar151 * 0.0;
  auVar174._0_4_ = fVar171 * 0.5;
  auVar174._4_4_ = fVar142 * 0.5;
  auVar174._8_4_ = fVar188 * 0.5;
  auVar174._12_4_ = fVar149 * 0.5;
  auVar67 = vsubps_avx(auVar211,auVar174);
  auVar62 = vsubps_avx(auVar67,auVar194);
  auVar67 = vshufps_avx(auVar127,auVar127,0xc9);
  auVar241 = vshufps_avx(auVar264,auVar264,0xc9);
  fVar85 = auVar127._0_4_;
  auVar212._0_4_ = fVar85 * auVar241._0_4_;
  fVar86 = auVar127._4_4_;
  auVar212._4_4_ = fVar86 * auVar241._4_4_;
  fVar87 = auVar127._8_4_;
  auVar212._8_4_ = fVar87 * auVar241._8_4_;
  fVar88 = auVar127._12_4_;
  auVar212._12_4_ = fVar88 * auVar241._12_4_;
  auVar221._0_4_ = auVar264._0_4_ * auVar67._0_4_;
  auVar221._4_4_ = auVar264._4_4_ * auVar67._4_4_;
  auVar221._8_4_ = auVar264._8_4_ * auVar67._8_4_;
  auVar221._12_4_ = auVar264._12_4_ * auVar67._12_4_;
  auVar241 = vsubps_avx(auVar221,auVar212);
  auVar10 = vshufps_avx(auVar241,auVar241,0xc9);
  auVar241 = vshufps_avx(auVar11,auVar11,0xc9);
  auVar213._0_4_ = fVar85 * auVar241._0_4_;
  auVar213._4_4_ = fVar86 * auVar241._4_4_;
  auVar213._8_4_ = fVar87 * auVar241._8_4_;
  auVar213._12_4_ = fVar88 * auVar241._12_4_;
  auVar175._0_4_ = auVar11._0_4_ * auVar67._0_4_;
  auVar175._4_4_ = auVar11._4_4_ * auVar67._4_4_;
  auVar175._8_4_ = auVar11._8_4_ * auVar67._8_4_;
  auVar175._12_4_ = auVar11._12_4_ * auVar67._12_4_;
  auVar67 = vsubps_avx(auVar175,auVar213);
  auVar11 = vshufps_avx(auVar67,auVar67,0xc9);
  auVar67 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar241 = vshufps_avx(auVar238,auVar238,0xc9);
  fVar152 = auVar61._0_4_;
  auVar176._0_4_ = fVar152 * auVar241._0_4_;
  fVar191 = auVar61._4_4_;
  auVar176._4_4_ = fVar191 * auVar241._4_4_;
  fVar170 = auVar61._8_4_;
  auVar176._8_4_ = fVar170 * auVar241._8_4_;
  fVar219 = auVar61._12_4_;
  auVar176._12_4_ = fVar219 * auVar241._12_4_;
  auVar239._0_4_ = auVar238._0_4_ * auVar67._0_4_;
  auVar239._4_4_ = auVar238._4_4_ * auVar67._4_4_;
  auVar239._8_4_ = auVar238._8_4_ * auVar67._8_4_;
  auVar239._12_4_ = auVar238._12_4_ * auVar67._12_4_;
  auVar241 = vsubps_avx(auVar239,auVar176);
  auVar12 = vshufps_avx(auVar241,auVar241,0xc9);
  auVar241 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar240._0_4_ = auVar241._0_4_ * fVar152;
  auVar240._4_4_ = auVar241._4_4_ * fVar191;
  auVar240._8_4_ = auVar241._8_4_ * fVar170;
  auVar240._12_4_ = auVar241._12_4_ * fVar219;
  auVar195._0_4_ = auVar67._0_4_ * auVar62._0_4_;
  auVar195._4_4_ = auVar67._4_4_ * auVar62._4_4_;
  auVar195._8_4_ = auVar67._8_4_ * auVar62._8_4_;
  auVar195._12_4_ = auVar67._12_4_ * auVar62._12_4_;
  auVar241 = vsubps_avx(auVar195,auVar240);
  auVar67 = vdpps_avx(auVar10,auVar10,0x7f);
  auVar62 = vshufps_avx(auVar241,auVar241,0xc9);
  fVar189 = auVar67._0_4_;
  auVar118 = ZEXT416((uint)fVar189);
  auVar241 = vrsqrtss_avx(auVar118,auVar118);
  fVar171 = auVar241._0_4_;
  auVar241 = vdpps_avx(auVar10,auVar11,0x7f);
  auVar96 = ZEXT416((uint)(fVar171 * 1.5 - fVar189 * 0.5 * fVar171 * fVar171 * fVar171));
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  fVar171 = auVar10._0_4_ * auVar96._0_4_;
  fVar142 = auVar10._4_4_ * auVar96._4_4_;
  fVar188 = auVar10._8_4_ * auVar96._8_4_;
  fVar149 = auVar10._12_4_ * auVar96._12_4_;
  auVar67 = vshufps_avx(auVar67,auVar67,0);
  auVar257._0_4_ = auVar11._0_4_ * auVar67._0_4_;
  auVar257._4_4_ = auVar11._4_4_ * auVar67._4_4_;
  auVar257._8_4_ = auVar11._8_4_ * auVar67._8_4_;
  auVar257._12_4_ = auVar11._12_4_ * auVar67._12_4_;
  auVar67 = vshufps_avx(auVar241,auVar241,0);
  auVar222._0_4_ = auVar10._0_4_ * auVar67._0_4_;
  auVar222._4_4_ = auVar10._4_4_ * auVar67._4_4_;
  auVar222._8_4_ = auVar10._8_4_ * auVar67._8_4_;
  auVar222._12_4_ = auVar10._12_4_ * auVar67._12_4_;
  auVar91 = vsubps_avx(auVar257,auVar222);
  auVar241 = vrcpss_avx(auVar118,auVar118);
  auVar67 = vdpps_avx(auVar12,auVar12,0x7f);
  auVar241 = ZEXT416((uint)(auVar241._0_4_ * (2.0 - fVar189 * auVar241._0_4_)));
  auVar10 = vshufps_avx(auVar241,auVar241,0);
  fVar189 = auVar67._0_4_;
  auVar118 = ZEXT416((uint)fVar189);
  auVar241 = vrsqrtss_avx(auVar118,auVar118);
  fVar150 = auVar241._0_4_;
  auVar241 = ZEXT416((uint)(fVar150 * 1.5 - fVar189 * 0.5 * fVar150 * fVar150 * fVar150));
  auVar11 = vshufps_avx(auVar241,auVar241,0);
  auVar241 = vdpps_avx(auVar12,auVar62,0x7f);
  fVar150 = auVar11._0_4_ * auVar12._0_4_;
  fVar190 = auVar11._4_4_ * auVar12._4_4_;
  fVar151 = auVar11._8_4_ * auVar12._8_4_;
  fVar192 = auVar11._12_4_ * auVar12._12_4_;
  auVar67 = vshufps_avx(auVar67,auVar67,0);
  auVar214._0_4_ = auVar67._0_4_ * auVar62._0_4_;
  auVar214._4_4_ = auVar67._4_4_ * auVar62._4_4_;
  auVar214._8_4_ = auVar67._8_4_ * auVar62._8_4_;
  auVar214._12_4_ = auVar67._12_4_ * auVar62._12_4_;
  auVar67 = vshufps_avx(auVar241,auVar241,0);
  auVar177._0_4_ = auVar67._0_4_ * auVar12._0_4_;
  auVar177._4_4_ = auVar67._4_4_ * auVar12._4_4_;
  auVar177._8_4_ = auVar67._8_4_ * auVar12._8_4_;
  auVar177._12_4_ = auVar67._12_4_ * auVar12._12_4_;
  auVar62 = vsubps_avx(auVar214,auVar177);
  auVar67 = vrcpss_avx(auVar118,auVar118);
  auVar67 = ZEXT416((uint)((2.0 - fVar189 * auVar67._0_4_) * auVar67._0_4_));
  auVar67 = vshufps_avx(auVar67,auVar67,0);
  auVar241 = vshufps_avx(_local_538,_local_538,0xff);
  auVar242._0_4_ = auVar241._0_4_ * fVar171;
  auVar242._4_4_ = auVar241._4_4_ * fVar142;
  auVar242._8_4_ = auVar241._8_4_ * fVar188;
  auVar242._12_4_ = auVar241._12_4_ * fVar149;
  _local_418 = vsubps_avx(_local_538,auVar242);
  auVar12 = vshufps_avx(auVar127,auVar127,0xff);
  auVar196._0_4_ =
       auVar12._0_4_ * fVar171 + auVar96._0_4_ * auVar91._0_4_ * auVar10._0_4_ * auVar241._0_4_;
  auVar196._4_4_ =
       auVar12._4_4_ * fVar142 + auVar96._4_4_ * auVar91._4_4_ * auVar10._4_4_ * auVar241._4_4_;
  auVar196._8_4_ =
       auVar12._8_4_ * fVar188 + auVar96._8_4_ * auVar91._8_4_ * auVar10._8_4_ * auVar241._8_4_;
  auVar196._12_4_ =
       auVar12._12_4_ * fVar149 + auVar96._12_4_ * auVar91._12_4_ * auVar10._12_4_ * auVar241._12_4_
  ;
  auVar12 = vsubps_avx(auVar127,auVar196);
  local_428._0_4_ = auVar242._0_4_ + (float)local_538._0_4_;
  local_428._4_4_ = auVar242._4_4_ + (float)local_538._4_4_;
  fStack_420 = auVar242._8_4_ + fStack_530;
  fStack_41c = auVar242._12_4_ + fStack_52c;
  auVar241 = vshufps_avx(_local_578,_local_578,0xff);
  auVar122._0_4_ = fVar150 * auVar241._0_4_;
  auVar122._4_4_ = fVar190 * auVar241._4_4_;
  auVar122._8_4_ = fVar151 * auVar241._8_4_;
  auVar122._12_4_ = fVar192 * auVar241._12_4_;
  _local_438 = vsubps_avx(_local_578,auVar122);
  auVar10 = vshufps_avx(auVar61,auVar61,0xff);
  auVar92._0_4_ =
       fVar150 * auVar10._0_4_ + auVar241._0_4_ * auVar11._0_4_ * auVar62._0_4_ * auVar67._0_4_;
  auVar92._4_4_ =
       fVar190 * auVar10._4_4_ + auVar241._4_4_ * auVar11._4_4_ * auVar62._4_4_ * auVar67._4_4_;
  auVar92._8_4_ =
       fVar151 * auVar10._8_4_ + auVar241._8_4_ * auVar11._8_4_ * auVar62._8_4_ * auVar67._8_4_;
  auVar92._12_4_ =
       fVar192 * auVar10._12_4_ + auVar241._12_4_ * auVar11._12_4_ * auVar62._12_4_ * auVar67._12_4_
  ;
  auVar11 = vsubps_avx(auVar61,auVar92);
  local_448._0_4_ = (float)local_578._0_4_ + auVar122._0_4_;
  local_448._4_4_ = (float)local_578._4_4_ + auVar122._4_4_;
  fStack_440 = fStack_570 + auVar122._8_4_;
  fStack_43c = fStack_56c + auVar122._12_4_;
  local_458._0_4_ = local_418._0_4_ + auVar12._0_4_ * 0.33333334;
  local_458._4_4_ = local_418._4_4_ + auVar12._4_4_ * 0.33333334;
  fStack_450 = local_418._8_4_ + auVar12._8_4_ * 0.33333334;
  fStack_44c = local_418._12_4_ + auVar12._12_4_ * 0.33333334;
  local_288 = vsubps_avx(_local_418,auVar137);
  auVar241 = vmovsldup_avx(local_288);
  auVar67 = vmovshdup_avx(local_288);
  auVar10 = vshufps_avx(local_288,local_288,0xaa);
  fVar171 = pre->ray_space[k].vx.field_0.m128[0];
  fVar142 = pre->ray_space[k].vx.field_0.m128[1];
  fVar188 = pre->ray_space[k].vx.field_0.m128[2];
  fVar149 = pre->ray_space[k].vx.field_0.m128[3];
  fVar189 = pre->ray_space[k].vy.field_0.m128[0];
  fVar150 = pre->ray_space[k].vy.field_0.m128[1];
  fVar190 = pre->ray_space[k].vy.field_0.m128[2];
  fVar151 = pre->ray_space[k].vy.field_0.m128[3];
  fVar192 = pre->ray_space[k].vz.field_0.m128[0];
  fVar205 = pre->ray_space[k].vz.field_0.m128[1];
  fVar206 = pre->ray_space[k].vz.field_0.m128[2];
  fVar207 = pre->ray_space[k].vz.field_0.m128[3];
  fVar89 = fVar171 * auVar241._0_4_ + auVar10._0_4_ * fVar192 + fVar189 * auVar67._0_4_;
  fVar115 = fVar142 * auVar241._4_4_ + auVar10._4_4_ * fVar205 + fVar150 * auVar67._4_4_;
  local_538._4_4_ = fVar115;
  local_538._0_4_ = fVar89;
  fStack_530 = fVar188 * auVar241._8_4_ + auVar10._8_4_ * fVar206 + fVar190 * auVar67._8_4_;
  fStack_52c = fVar149 * auVar241._12_4_ + auVar10._12_4_ * fVar207 + fVar151 * auVar67._12_4_;
  local_298 = vsubps_avx(_local_458,auVar137);
  auVar10 = vshufps_avx(local_298,local_298,0xaa);
  auVar67 = vmovshdup_avx(local_298);
  auVar241 = vmovsldup_avx(local_298);
  fVar90 = auVar241._0_4_ * fVar171 + auVar67._0_4_ * fVar189 + fVar192 * auVar10._0_4_;
  fVar116 = auVar241._4_4_ * fVar142 + auVar67._4_4_ * fVar150 + fVar205 * auVar10._4_4_;
  local_568._4_4_ = fVar116;
  local_568._0_4_ = fVar90;
  fStack_560 = auVar241._8_4_ * fVar188 + auVar67._8_4_ * fVar190 + fVar206 * auVar10._8_4_;
  fStack_55c = auVar241._12_4_ * fVar149 + auVar67._12_4_ * fVar151 + fVar207 * auVar10._12_4_;
  auVar178._0_4_ = auVar11._0_4_ * 0.33333334;
  auVar178._4_4_ = auVar11._4_4_ * 0.33333334;
  auVar178._8_4_ = auVar11._8_4_ * 0.33333334;
  auVar178._12_4_ = auVar11._12_4_ * 0.33333334;
  _local_468 = vsubps_avx(_local_438,auVar178);
  local_2a8 = vsubps_avx(_local_468,auVar137);
  auVar10 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar67 = vmovshdup_avx(local_2a8);
  auVar241 = vmovsldup_avx(local_2a8);
  auVar290._0_4_ = auVar241._0_4_ * fVar171 + auVar67._0_4_ * fVar189 + fVar192 * auVar10._0_4_;
  auVar290._4_4_ = auVar241._4_4_ * fVar142 + auVar67._4_4_ * fVar150 + fVar205 * auVar10._4_4_;
  auVar290._8_4_ = auVar241._8_4_ * fVar188 + auVar67._8_4_ * fVar190 + fVar206 * auVar10._8_4_;
  auVar290._12_4_ = auVar241._12_4_ * fVar149 + auVar67._12_4_ * fVar151 + fVar207 * auVar10._12_4_;
  local_2b8 = vsubps_avx(_local_438,auVar137);
  auVar10 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar67 = vmovshdup_avx(local_2b8);
  auVar241 = vmovsldup_avx(local_2b8);
  auVar285._0_4_ = auVar241._0_4_ * fVar171 + auVar67._0_4_ * fVar189 + auVar10._0_4_ * fVar192;
  auVar285._4_4_ = auVar241._4_4_ * fVar142 + auVar67._4_4_ * fVar150 + auVar10._4_4_ * fVar205;
  auVar285._8_4_ = auVar241._8_4_ * fVar188 + auVar67._8_4_ * fVar190 + auVar10._8_4_ * fVar206;
  auVar285._12_4_ = auVar241._12_4_ * fVar149 + auVar67._12_4_ * fVar151 + auVar10._12_4_ * fVar207;
  local_2c8 = vsubps_avx(_local_428,auVar137);
  auVar10 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar67 = vmovshdup_avx(local_2c8);
  auVar241 = vmovsldup_avx(local_2c8);
  auVar273._0_4_ = auVar241._0_4_ * fVar171 + auVar67._0_4_ * fVar189 + auVar10._0_4_ * fVar192;
  auVar273._4_4_ = auVar241._4_4_ * fVar142 + auVar67._4_4_ * fVar150 + auVar10._4_4_ * fVar205;
  auVar273._8_4_ = auVar241._8_4_ * fVar188 + auVar67._8_4_ * fVar190 + auVar10._8_4_ * fVar206;
  auVar273._12_4_ = auVar241._12_4_ * fVar149 + auVar67._12_4_ * fVar151 + auVar10._12_4_ * fVar207;
  local_478._0_4_ = (fVar85 + auVar196._0_4_) * 0.33333334 + (float)local_428._0_4_;
  local_478._4_4_ = (fVar86 + auVar196._4_4_) * 0.33333334 + (float)local_428._4_4_;
  fStack_470 = (fVar87 + auVar196._8_4_) * 0.33333334 + fStack_420;
  fStack_46c = (fVar88 + auVar196._12_4_) * 0.33333334 + fStack_41c;
  local_2d8 = vsubps_avx(_local_478,auVar137);
  auVar10 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar67 = vmovshdup_avx(local_2d8);
  auVar241 = vmovsldup_avx(local_2d8);
  auVar223._0_4_ = auVar241._0_4_ * fVar171 + auVar67._0_4_ * fVar189 + auVar10._0_4_ * fVar192;
  auVar223._4_4_ = auVar241._4_4_ * fVar142 + auVar67._4_4_ * fVar150 + auVar10._4_4_ * fVar205;
  auVar223._8_4_ = auVar241._8_4_ * fVar188 + auVar67._8_4_ * fVar190 + auVar10._8_4_ * fVar206;
  auVar223._12_4_ = auVar241._12_4_ * fVar149 + auVar67._12_4_ * fVar151 + auVar10._12_4_ * fVar207;
  auVar215._0_4_ = (fVar152 + auVar92._0_4_) * 0.33333334;
  auVar215._4_4_ = (fVar191 + auVar92._4_4_) * 0.33333334;
  auVar215._8_4_ = (fVar170 + auVar92._8_4_) * 0.33333334;
  auVar215._12_4_ = (fVar219 + auVar92._12_4_) * 0.33333334;
  _local_328 = vsubps_avx(_local_448,auVar215);
  local_2e8 = vsubps_avx(_local_328,auVar137);
  auVar10 = vshufps_avx(local_2e8,local_2e8,0xaa);
  auVar67 = vmovshdup_avx(local_2e8);
  auVar241 = vmovsldup_avx(local_2e8);
  auVar243._0_4_ = auVar241._0_4_ * fVar171 + auVar67._0_4_ * fVar189 + fVar192 * auVar10._0_4_;
  auVar243._4_4_ = auVar241._4_4_ * fVar142 + auVar67._4_4_ * fVar150 + fVar205 * auVar10._4_4_;
  auVar243._8_4_ = auVar241._8_4_ * fVar188 + auVar67._8_4_ * fVar190 + fVar206 * auVar10._8_4_;
  auVar243._12_4_ = auVar241._12_4_ * fVar149 + auVar67._12_4_ * fVar151 + fVar207 * auVar10._12_4_;
  local_2f8 = vsubps_avx(_local_448,auVar137);
  auVar137 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar67 = vmovshdup_avx(local_2f8);
  auVar241 = vmovsldup_avx(local_2f8);
  auVar93._0_4_ = fVar171 * auVar241._0_4_ + fVar189 * auVar67._0_4_ + fVar192 * auVar137._0_4_;
  auVar93._4_4_ = fVar142 * auVar241._4_4_ + fVar150 * auVar67._4_4_ + fVar205 * auVar137._4_4_;
  auVar93._8_4_ = fVar188 * auVar241._8_4_ + fVar190 * auVar67._8_4_ + fVar206 * auVar137._8_4_;
  auVar93._12_4_ = fVar149 * auVar241._12_4_ + fVar151 * auVar67._12_4_ + fVar207 * auVar137._12_4_;
  auVar10 = vmovlhps_avx(_local_538,auVar273);
  auVar11 = vmovlhps_avx(_local_568,auVar223);
  auVar12 = vmovlhps_avx(auVar290,auVar243);
  _local_3f8 = vmovlhps_avx(auVar285,auVar93);
  auVar67 = vminps_avx(auVar10,auVar11);
  auVar241 = vminps_avx(auVar12,_local_3f8);
  auVar137 = vminps_avx(auVar67,auVar241);
  auVar67 = vmaxps_avx(auVar10,auVar11);
  auVar241 = vmaxps_avx(auVar12,_local_3f8);
  auVar67 = vmaxps_avx(auVar67,auVar241);
  auVar241 = vshufpd_avx(auVar137,auVar137,3);
  auVar137 = vminps_avx(auVar137,auVar241);
  auVar241 = vshufpd_avx(auVar67,auVar67,3);
  auVar241 = vmaxps_avx(auVar67,auVar241);
  auVar197._8_4_ = 0x7fffffff;
  auVar197._0_8_ = 0x7fffffff7fffffff;
  auVar197._12_4_ = 0x7fffffff;
  auVar67 = vandps_avx(auVar137,auVar197);
  auVar241 = vandps_avx(auVar241,auVar197);
  auVar67 = vmaxps_avx(auVar67,auVar241);
  auVar241 = vmovshdup_avx(auVar67);
  auVar67 = vmaxss_avx(auVar241,auVar67);
  fVar171 = auVar67._0_4_ * 9.536743e-07;
  local_408 = ZEXT416((uint)fVar171);
  auVar67 = vshufps_avx(local_408,ZEXT416((uint)fVar171),0);
  local_78._16_16_ = auVar67;
  local_78._0_16_ = auVar67;
  auVar63._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
  auVar63._8_4_ = auVar67._8_4_ ^ 0x80000000;
  auVar63._12_4_ = auVar67._12_4_ ^ 0x80000000;
  local_248._16_16_ = auVar63;
  local_248._0_16_ = auVar63;
  local_338 = vpshufd_avx(ZEXT416(uVar52),0);
  local_348 = vshufps_avx(ZEXT416(uVar55),ZEXT416(uVar55),0);
  bVar58 = false;
  uVar55 = 0;
  fVar171 = *(float *)(ray + k * 4 + 0x30);
  _local_258 = vsubps_avx(auVar11,auVar10);
  _local_268 = vsubps_avx(auVar12,auVar11);
  _local_278 = vsubps_avx(_local_3f8,auVar12);
  _local_358 = vsubps_avx(_local_428,_local_418);
  _local_368 = vsubps_avx(_local_478,_local_458);
  _local_378 = vsubps_avx(_local_328,_local_468);
  _local_388 = vsubps_avx(_local_448,_local_438);
  auVar204 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar261 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_00e3b136:
  do {
    local_308 = auVar261._0_16_;
    auVar119 = auVar204._0_16_;
    auVar67 = vshufps_avx(auVar119,auVar119,0x50);
    auVar291._8_4_ = 0x3f800000;
    auVar291._0_8_ = 0x3f8000003f800000;
    auVar291._12_4_ = 0x3f800000;
    auVar294._16_4_ = 0x3f800000;
    auVar294._0_16_ = auVar291;
    auVar294._20_4_ = 0x3f800000;
    auVar294._24_4_ = 0x3f800000;
    auVar294._28_4_ = 0x3f800000;
    auVar241 = vsubps_avx(auVar291,auVar67);
    fVar142 = auVar67._0_4_;
    fVar149 = auVar67._4_4_;
    fVar150 = auVar67._8_4_;
    fVar151 = auVar67._12_4_;
    fVar188 = auVar241._0_4_;
    fVar189 = auVar241._4_4_;
    fVar190 = auVar241._8_4_;
    fVar192 = auVar241._12_4_;
    auVar145._0_4_ = auVar273._0_4_ * fVar142 + fVar89 * fVar188;
    auVar145._4_4_ = auVar273._4_4_ * fVar149 + fVar115 * fVar189;
    auVar145._8_4_ = auVar273._0_4_ * fVar150 + fVar89 * fVar190;
    auVar145._12_4_ = auVar273._4_4_ * fVar151 + fVar115 * fVar192;
    auVar123._0_4_ = auVar223._0_4_ * fVar142 + fVar90 * fVar188;
    auVar123._4_4_ = auVar223._4_4_ * fVar149 + fVar116 * fVar189;
    auVar123._8_4_ = auVar223._0_4_ * fVar150 + fVar90 * fVar190;
    auVar123._12_4_ = auVar223._4_4_ * fVar151 + fVar116 * fVar192;
    auVar216._0_4_ = auVar243._0_4_ * fVar142 + auVar290._0_4_ * fVar188;
    auVar216._4_4_ = auVar243._4_4_ * fVar149 + auVar290._4_4_ * fVar189;
    auVar216._8_4_ = auVar243._0_4_ * fVar150 + auVar290._0_4_ * fVar190;
    auVar216._12_4_ = auVar243._4_4_ * fVar151 + auVar290._4_4_ * fVar192;
    auVar156._0_4_ = auVar93._0_4_ * fVar142 + auVar285._0_4_ * fVar188;
    auVar156._4_4_ = auVar93._4_4_ * fVar149 + auVar285._4_4_ * fVar189;
    auVar156._8_4_ = auVar93._0_4_ * fVar150 + auVar285._0_4_ * fVar190;
    auVar156._12_4_ = auVar93._4_4_ * fVar151 + auVar285._4_4_ * fVar192;
    auVar67 = vmovshdup_avx(local_308);
    auVar241 = vshufps_avx(local_308,local_308,0);
    auVar249._16_16_ = auVar241;
    auVar249._0_16_ = auVar241;
    auVar137 = vshufps_avx(local_308,local_308,0x55);
    auVar80._16_16_ = auVar137;
    auVar80._0_16_ = auVar137;
    auVar79 = vsubps_avx(auVar80,auVar249);
    auVar137 = vshufps_avx(auVar145,auVar145,0);
    auVar62 = vshufps_avx(auVar145,auVar145,0x55);
    auVar96 = vshufps_avx(auVar123,auVar123,0);
    auVar127 = vshufps_avx(auVar123,auVar123,0x55);
    auVar61 = vshufps_avx(auVar216,auVar216,0);
    auVar91 = vshufps_avx(auVar216,auVar216,0x55);
    auVar118 = vshufps_avx(auVar156,auVar156,0);
    auVar117 = vshufps_avx(auVar156,auVar156,0x55);
    auVar67 = ZEXT416((uint)((auVar67._0_4_ - auVar261._0_4_) * 0.04761905));
    auVar67 = vshufps_avx(auVar67,auVar67,0);
    auVar260._0_4_ = auVar241._0_4_ + auVar79._0_4_ * 0.0;
    auVar260._4_4_ = auVar241._4_4_ + auVar79._4_4_ * 0.14285715;
    auVar260._8_4_ = auVar241._8_4_ + auVar79._8_4_ * 0.2857143;
    auVar260._12_4_ = auVar241._12_4_ + auVar79._12_4_ * 0.42857146;
    auVar260._16_4_ = auVar241._0_4_ + auVar79._16_4_ * 0.5714286;
    auVar260._20_4_ = auVar241._4_4_ + auVar79._20_4_ * 0.71428573;
    auVar260._24_4_ = auVar241._8_4_ + auVar79._24_4_ * 0.8571429;
    auVar260._28_4_ = auVar241._12_4_ + auVar79._28_4_;
    auVar13 = vsubps_avx(auVar294,auVar260);
    fVar142 = auVar96._0_4_;
    fVar149 = auVar96._4_4_;
    fVar150 = auVar96._8_4_;
    fVar151 = auVar96._12_4_;
    fVar235 = auVar13._0_4_;
    fVar251 = auVar13._4_4_;
    fVar252 = auVar13._8_4_;
    fVar253 = auVar13._12_4_;
    fVar254 = auVar13._16_4_;
    fVar255 = auVar13._20_4_;
    fVar256 = auVar13._24_4_;
    fVar231 = auVar127._0_4_;
    fVar232 = auVar127._4_4_;
    fVar233 = auVar127._8_4_;
    fVar234 = auVar127._12_4_;
    fVar288 = auVar62._12_4_ + 1.0;
    fVar191 = auVar61._0_4_;
    fVar170 = auVar61._4_4_;
    fVar219 = auVar61._8_4_;
    fVar230 = auVar61._12_4_;
    fVar205 = fVar191 * auVar260._0_4_ + fVar235 * fVar142;
    fVar206 = fVar170 * auVar260._4_4_ + fVar251 * fVar149;
    fVar207 = fVar219 * auVar260._8_4_ + fVar252 * fVar150;
    fVar85 = fVar230 * auVar260._12_4_ + fVar253 * fVar151;
    fVar86 = fVar191 * auVar260._16_4_ + fVar254 * fVar142;
    fVar87 = fVar170 * auVar260._20_4_ + fVar255 * fVar149;
    fVar88 = fVar219 * auVar260._24_4_ + fVar256 * fVar150;
    fVar188 = auVar91._0_4_;
    fVar189 = auVar91._4_4_;
    fVar190 = auVar91._8_4_;
    fVar192 = auVar91._12_4_;
    fVar270 = fVar231 * fVar235 + auVar260._0_4_ * fVar188;
    fVar275 = fVar232 * fVar251 + auVar260._4_4_ * fVar189;
    fVar276 = fVar233 * fVar252 + auVar260._8_4_ * fVar190;
    fVar277 = fVar234 * fVar253 + auVar260._12_4_ * fVar192;
    fVar278 = fVar231 * fVar254 + auVar260._16_4_ * fVar188;
    fVar279 = fVar232 * fVar255 + auVar260._20_4_ * fVar189;
    fVar280 = fVar233 * fVar256 + auVar260._24_4_ * fVar190;
    fVar281 = fVar234 + fVar151;
    auVar241 = vshufps_avx(auVar145,auVar145,0xaa);
    auVar96 = vshufps_avx(auVar145,auVar145,0xff);
    fVar152 = fVar230 + 0.0;
    auVar127 = vshufps_avx(auVar123,auVar123,0xaa);
    auVar61 = vshufps_avx(auVar123,auVar123,0xff);
    auVar168._0_4_ =
         fVar235 * (auVar260._0_4_ * fVar142 + fVar235 * auVar137._0_4_) + auVar260._0_4_ * fVar205;
    auVar168._4_4_ =
         fVar251 * (auVar260._4_4_ * fVar149 + fVar251 * auVar137._4_4_) + auVar260._4_4_ * fVar206;
    auVar168._8_4_ =
         fVar252 * (auVar260._8_4_ * fVar150 + fVar252 * auVar137._8_4_) + auVar260._8_4_ * fVar207;
    auVar168._12_4_ =
         fVar253 * (auVar260._12_4_ * fVar151 + fVar253 * auVar137._12_4_) +
         auVar260._12_4_ * fVar85;
    auVar168._16_4_ =
         fVar254 * (auVar260._16_4_ * fVar142 + fVar254 * auVar137._0_4_) + auVar260._16_4_ * fVar86
    ;
    auVar168._20_4_ =
         fVar255 * (auVar260._20_4_ * fVar149 + fVar255 * auVar137._4_4_) + auVar260._20_4_ * fVar87
    ;
    auVar168._24_4_ =
         fVar256 * (auVar260._24_4_ * fVar150 + fVar256 * auVar137._8_4_) + auVar260._24_4_ * fVar88
    ;
    auVar168._28_4_ = auVar137._12_4_ + 1.0 + fVar192;
    auVar186._0_4_ =
         fVar235 * (fVar231 * auVar260._0_4_ + auVar62._0_4_ * fVar235) + auVar260._0_4_ * fVar270;
    auVar186._4_4_ =
         fVar251 * (fVar232 * auVar260._4_4_ + auVar62._4_4_ * fVar251) + auVar260._4_4_ * fVar275;
    auVar186._8_4_ =
         fVar252 * (fVar233 * auVar260._8_4_ + auVar62._8_4_ * fVar252) + auVar260._8_4_ * fVar276;
    auVar186._12_4_ =
         fVar253 * (fVar234 * auVar260._12_4_ + auVar62._12_4_ * fVar253) +
         auVar260._12_4_ * fVar277;
    auVar186._16_4_ =
         fVar254 * (fVar231 * auVar260._16_4_ + auVar62._0_4_ * fVar254) + auVar260._16_4_ * fVar278
    ;
    auVar186._20_4_ =
         fVar255 * (fVar232 * auVar260._20_4_ + auVar62._4_4_ * fVar255) + auVar260._20_4_ * fVar279
    ;
    auVar186._24_4_ =
         fVar256 * (fVar233 * auVar260._24_4_ + auVar62._8_4_ * fVar256) + auVar260._24_4_ * fVar280
    ;
    auVar186._28_4_ = auVar117._12_4_ + fVar192;
    auVar81._0_4_ =
         fVar235 * fVar205 + auVar260._0_4_ * (fVar191 * fVar235 + auVar118._0_4_ * auVar260._0_4_);
    auVar81._4_4_ =
         fVar251 * fVar206 + auVar260._4_4_ * (fVar170 * fVar251 + auVar118._4_4_ * auVar260._4_4_);
    auVar81._8_4_ =
         fVar252 * fVar207 + auVar260._8_4_ * (fVar219 * fVar252 + auVar118._8_4_ * auVar260._8_4_);
    auVar81._12_4_ =
         fVar253 * fVar85 +
         auVar260._12_4_ * (fVar230 * fVar253 + auVar118._12_4_ * auVar260._12_4_);
    auVar81._16_4_ =
         fVar254 * fVar86 + auVar260._16_4_ * (fVar191 * fVar254 + auVar118._0_4_ * auVar260._16_4_)
    ;
    auVar81._20_4_ =
         fVar255 * fVar87 + auVar260._20_4_ * (fVar170 * fVar255 + auVar118._4_4_ * auVar260._20_4_)
    ;
    auVar81._24_4_ =
         fVar256 * fVar88 + auVar260._24_4_ * (fVar219 * fVar256 + auVar118._8_4_ * auVar260._24_4_)
    ;
    auVar81._28_4_ = fVar151 + 1.0 + fVar152;
    auVar269._0_4_ =
         fVar235 * fVar270 + auVar260._0_4_ * (auVar117._0_4_ * auVar260._0_4_ + fVar235 * fVar188);
    auVar269._4_4_ =
         fVar251 * fVar275 + auVar260._4_4_ * (auVar117._4_4_ * auVar260._4_4_ + fVar251 * fVar189);
    auVar269._8_4_ =
         fVar252 * fVar276 + auVar260._8_4_ * (auVar117._8_4_ * auVar260._8_4_ + fVar252 * fVar190);
    auVar269._12_4_ =
         fVar253 * fVar277 +
         auVar260._12_4_ * (auVar117._12_4_ * auVar260._12_4_ + fVar253 * fVar192);
    auVar269._16_4_ =
         fVar254 * fVar278 +
         auVar260._16_4_ * (auVar117._0_4_ * auVar260._16_4_ + fVar254 * fVar188);
    auVar269._20_4_ =
         fVar255 * fVar279 +
         auVar260._20_4_ * (auVar117._4_4_ * auVar260._20_4_ + fVar255 * fVar189);
    auVar269._24_4_ =
         fVar256 * fVar280 +
         auVar260._24_4_ * (auVar117._8_4_ * auVar260._24_4_ + fVar256 * fVar190);
    auVar269._28_4_ = fVar152 + fVar192 + 0.0;
    local_b8._0_4_ = fVar235 * auVar168._0_4_ + auVar260._0_4_ * auVar81._0_4_;
    local_b8._4_4_ = fVar251 * auVar168._4_4_ + auVar260._4_4_ * auVar81._4_4_;
    local_b8._8_4_ = fVar252 * auVar168._8_4_ + auVar260._8_4_ * auVar81._8_4_;
    local_b8._12_4_ = fVar253 * auVar168._12_4_ + auVar260._12_4_ * auVar81._12_4_;
    local_b8._16_4_ = fVar254 * auVar168._16_4_ + auVar260._16_4_ * auVar81._16_4_;
    local_b8._20_4_ = fVar255 * auVar168._20_4_ + auVar260._20_4_ * auVar81._20_4_;
    local_b8._24_4_ = fVar256 * auVar168._24_4_ + auVar260._24_4_ * auVar81._24_4_;
    local_b8._28_4_ = fVar281 + fVar192 + 0.0;
    auVar148._0_4_ = fVar235 * auVar186._0_4_ + auVar260._0_4_ * auVar269._0_4_;
    auVar148._4_4_ = fVar251 * auVar186._4_4_ + auVar260._4_4_ * auVar269._4_4_;
    auVar148._8_4_ = fVar252 * auVar186._8_4_ + auVar260._8_4_ * auVar269._8_4_;
    auVar148._12_4_ = fVar253 * auVar186._12_4_ + auVar260._12_4_ * auVar269._12_4_;
    auVar148._16_4_ = fVar254 * auVar186._16_4_ + auVar260._16_4_ * auVar269._16_4_;
    auVar148._20_4_ = fVar255 * auVar186._20_4_ + auVar260._20_4_ * auVar269._20_4_;
    auVar148._24_4_ = fVar256 * auVar186._24_4_ + auVar260._24_4_ * auVar269._24_4_;
    auVar148._28_4_ = fVar281 + fVar152;
    auVar14 = vsubps_avx(auVar81,auVar168);
    auVar79 = vsubps_avx(auVar269,auVar186);
    local_4c8 = auVar67._0_4_;
    fStack_4c4 = auVar67._4_4_;
    fStack_4c0 = auVar67._8_4_;
    fStack_4bc = auVar67._12_4_;
    local_f8 = local_4c8 * auVar14._0_4_ * 3.0;
    fStack_f4 = fStack_4c4 * auVar14._4_4_ * 3.0;
    auVar15._4_4_ = fStack_f4;
    auVar15._0_4_ = local_f8;
    fStack_f0 = fStack_4c0 * auVar14._8_4_ * 3.0;
    auVar15._8_4_ = fStack_f0;
    fStack_ec = fStack_4bc * auVar14._12_4_ * 3.0;
    auVar15._12_4_ = fStack_ec;
    fStack_e8 = local_4c8 * auVar14._16_4_ * 3.0;
    auVar15._16_4_ = fStack_e8;
    fStack_e4 = fStack_4c4 * auVar14._20_4_ * 3.0;
    auVar15._20_4_ = fStack_e4;
    fStack_e0 = fStack_4c0 * auVar14._24_4_ * 3.0;
    auVar15._24_4_ = fStack_e0;
    auVar15._28_4_ = auVar14._28_4_;
    local_118 = local_4c8 * auVar79._0_4_ * 3.0;
    fStack_114 = fStack_4c4 * auVar79._4_4_ * 3.0;
    auVar16._4_4_ = fStack_114;
    auVar16._0_4_ = local_118;
    fStack_110 = fStack_4c0 * auVar79._8_4_ * 3.0;
    auVar16._8_4_ = fStack_110;
    fStack_10c = fStack_4bc * auVar79._12_4_ * 3.0;
    auVar16._12_4_ = fStack_10c;
    fStack_108 = local_4c8 * auVar79._16_4_ * 3.0;
    auVar16._16_4_ = fStack_108;
    fStack_104 = fStack_4c4 * auVar79._20_4_ * 3.0;
    auVar16._20_4_ = fStack_104;
    fStack_100 = fStack_4c0 * auVar79._24_4_ * 3.0;
    auVar16._24_4_ = fStack_100;
    auVar16._28_4_ = fVar281;
    auVar15 = vsubps_avx(local_b8,auVar15);
    auVar79 = vperm2f128_avx(auVar15,auVar15,1);
    auVar79 = vshufps_avx(auVar79,auVar15,0x30);
    auVar79 = vshufps_avx(auVar15,auVar79,0x29);
    auVar16 = vsubps_avx(auVar148,auVar16);
    auVar15 = vperm2f128_avx(auVar16,auVar16,1);
    auVar15 = vshufps_avx(auVar15,auVar16,0x30);
    auVar16 = vshufps_avx(auVar16,auVar15,0x29);
    fVar279 = auVar127._0_4_;
    fVar280 = auVar127._4_4_;
    fVar295 = auVar127._8_4_;
    fVar151 = auVar241._12_4_;
    fVar170 = auVar61._0_4_;
    fVar230 = auVar61._4_4_;
    fVar270 = auVar61._8_4_;
    fVar275 = auVar61._12_4_;
    auVar67 = vshufps_avx(auVar216,auVar216,0xaa);
    fVar142 = auVar67._0_4_;
    fVar149 = auVar67._4_4_;
    fVar150 = auVar67._8_4_;
    fVar192 = auVar67._12_4_;
    fVar207 = auVar260._0_4_ * fVar142 + fVar279 * fVar235;
    fVar85 = auVar260._4_4_ * fVar149 + fVar280 * fVar251;
    fVar86 = auVar260._8_4_ * fVar150 + fVar295 * fVar252;
    fVar87 = auVar260._12_4_ * fVar192 + auVar127._12_4_ * fVar253;
    fVar88 = auVar260._16_4_ * fVar142 + fVar279 * fVar254;
    fVar152 = auVar260._20_4_ * fVar149 + fVar280 * fVar255;
    fVar191 = auVar260._24_4_ * fVar150 + fVar295 * fVar256;
    auVar67 = vshufps_avx(auVar216,auVar216,0xff);
    fVar188 = auVar67._0_4_;
    fVar189 = auVar67._4_4_;
    fVar190 = auVar67._8_4_;
    fVar205 = auVar67._12_4_;
    fVar219 = auVar260._0_4_ * fVar188 + fVar170 * fVar235;
    fVar231 = auVar260._4_4_ * fVar189 + fVar230 * fVar251;
    fVar232 = auVar260._8_4_ * fVar190 + fVar270 * fVar252;
    fVar233 = auVar260._12_4_ * fVar205 + fVar275 * fVar253;
    fVar276 = auVar260._16_4_ * fVar188 + fVar170 * fVar254;
    fVar234 = auVar260._20_4_ * fVar189 + fVar230 * fVar255;
    fVar277 = auVar260._24_4_ * fVar190 + fVar270 * fVar256;
    auVar67 = vshufps_avx(auVar156,auVar156,0xaa);
    fVar278 = auVar67._12_4_ + fVar192;
    auVar137 = vshufps_avx(auVar156,auVar156,0xff);
    fVar206 = auVar137._12_4_;
    auVar82._0_4_ =
         fVar235 * (fVar279 * auVar260._0_4_ + fVar235 * auVar241._0_4_) + auVar260._0_4_ * fVar207;
    auVar82._4_4_ =
         fVar251 * (fVar280 * auVar260._4_4_ + fVar251 * auVar241._4_4_) + auVar260._4_4_ * fVar85;
    auVar82._8_4_ =
         fVar252 * (fVar295 * auVar260._8_4_ + fVar252 * auVar241._8_4_) + auVar260._8_4_ * fVar86;
    auVar82._12_4_ =
         fVar253 * (auVar127._12_4_ * auVar260._12_4_ + fVar253 * fVar151) +
         auVar260._12_4_ * fVar87;
    auVar82._16_4_ =
         fVar254 * (fVar279 * auVar260._16_4_ + fVar254 * auVar241._0_4_) + auVar260._16_4_ * fVar88
    ;
    auVar82._20_4_ =
         fVar255 * (fVar280 * auVar260._20_4_ + fVar255 * auVar241._4_4_) +
         auVar260._20_4_ * fVar152;
    auVar82._24_4_ =
         fVar256 * (fVar295 * auVar260._24_4_ + fVar256 * auVar241._8_4_) +
         auVar260._24_4_ * fVar191;
    auVar82._28_4_ = auVar16._28_4_ + fVar151 + fVar206;
    auVar111._0_4_ =
         fVar235 * (fVar170 * auVar260._0_4_ + auVar96._0_4_ * fVar235) + auVar260._0_4_ * fVar219;
    auVar111._4_4_ =
         fVar251 * (fVar230 * auVar260._4_4_ + auVar96._4_4_ * fVar251) + auVar260._4_4_ * fVar231;
    auVar111._8_4_ =
         fVar252 * (fVar270 * auVar260._8_4_ + auVar96._8_4_ * fVar252) + auVar260._8_4_ * fVar232;
    auVar111._12_4_ =
         fVar253 * (fVar275 * auVar260._12_4_ + auVar96._12_4_ * fVar253) +
         auVar260._12_4_ * fVar233;
    auVar111._16_4_ =
         fVar254 * (fVar170 * auVar260._16_4_ + auVar96._0_4_ * fVar254) + auVar260._16_4_ * fVar276
    ;
    auVar111._20_4_ =
         fVar255 * (fVar230 * auVar260._20_4_ + auVar96._4_4_ * fVar255) + auVar260._20_4_ * fVar234
    ;
    auVar111._24_4_ =
         fVar256 * (fVar270 * auVar260._24_4_ + auVar96._8_4_ * fVar256) + auVar260._24_4_ * fVar277
    ;
    auVar111._28_4_ = fVar151 + auVar15._28_4_ + fVar206;
    auVar15 = vperm2f128_avx(local_b8,local_b8,1);
    auVar15 = vshufps_avx(auVar15,local_b8,0x30);
    _local_3e8 = vshufps_avx(local_b8,auVar15,0x29);
    auVar187._0_4_ =
         auVar260._0_4_ * (auVar67._0_4_ * auVar260._0_4_ + fVar235 * fVar142) + fVar235 * fVar207;
    auVar187._4_4_ =
         auVar260._4_4_ * (auVar67._4_4_ * auVar260._4_4_ + fVar251 * fVar149) + fVar251 * fVar85;
    auVar187._8_4_ =
         auVar260._8_4_ * (auVar67._8_4_ * auVar260._8_4_ + fVar252 * fVar150) + fVar252 * fVar86;
    auVar187._12_4_ =
         auVar260._12_4_ * (auVar67._12_4_ * auVar260._12_4_ + fVar253 * fVar192) + fVar253 * fVar87
    ;
    auVar187._16_4_ =
         auVar260._16_4_ * (auVar67._0_4_ * auVar260._16_4_ + fVar254 * fVar142) + fVar254 * fVar88;
    auVar187._20_4_ =
         auVar260._20_4_ * (auVar67._4_4_ * auVar260._20_4_ + fVar255 * fVar149) + fVar255 * fVar152
    ;
    auVar187._24_4_ =
         auVar260._24_4_ * (auVar67._8_4_ * auVar260._24_4_ + fVar256 * fVar150) + fVar256 * fVar191
    ;
    auVar187._28_4_ = fVar278 + fVar288 + auVar186._28_4_;
    auVar229._0_4_ =
         fVar235 * fVar219 + auVar260._0_4_ * (auVar260._0_4_ * auVar137._0_4_ + fVar235 * fVar188);
    auVar229._4_4_ =
         fVar251 * fVar231 + auVar260._4_4_ * (auVar260._4_4_ * auVar137._4_4_ + fVar251 * fVar189);
    auVar229._8_4_ =
         fVar252 * fVar232 + auVar260._8_4_ * (auVar260._8_4_ * auVar137._8_4_ + fVar252 * fVar190);
    auVar229._12_4_ =
         fVar253 * fVar233 + auVar260._12_4_ * (auVar260._12_4_ * fVar206 + fVar253 * fVar205);
    auVar229._16_4_ =
         fVar254 * fVar276 +
         auVar260._16_4_ * (auVar260._16_4_ * auVar137._0_4_ + fVar254 * fVar188);
    auVar229._20_4_ =
         fVar255 * fVar234 +
         auVar260._20_4_ * (auVar260._20_4_ * auVar137._4_4_ + fVar255 * fVar189);
    auVar229._24_4_ =
         fVar256 * fVar277 +
         auVar260._24_4_ * (auVar260._24_4_ * auVar137._8_4_ + fVar256 * fVar190);
    auVar229._28_4_ = fVar288 + fVar275 + fVar206 + fVar205;
    auVar218._0_4_ = fVar235 * auVar82._0_4_ + auVar260._0_4_ * auVar187._0_4_;
    auVar218._4_4_ = fVar251 * auVar82._4_4_ + auVar260._4_4_ * auVar187._4_4_;
    auVar218._8_4_ = fVar252 * auVar82._8_4_ + auVar260._8_4_ * auVar187._8_4_;
    auVar218._12_4_ = fVar253 * auVar82._12_4_ + auVar260._12_4_ * auVar187._12_4_;
    auVar218._16_4_ = fVar254 * auVar82._16_4_ + auVar260._16_4_ * auVar187._16_4_;
    auVar218._20_4_ = fVar255 * auVar82._20_4_ + auVar260._20_4_ * auVar187._20_4_;
    auVar218._24_4_ = fVar256 * auVar82._24_4_ + auVar260._24_4_ * auVar187._24_4_;
    auVar218._28_4_ = fVar278 + fVar206 + fVar205;
    auVar250._0_4_ = fVar235 * auVar111._0_4_ + auVar260._0_4_ * auVar229._0_4_;
    auVar250._4_4_ = fVar251 * auVar111._4_4_ + auVar260._4_4_ * auVar229._4_4_;
    auVar250._8_4_ = fVar252 * auVar111._8_4_ + auVar260._8_4_ * auVar229._8_4_;
    auVar250._12_4_ = fVar253 * auVar111._12_4_ + auVar260._12_4_ * auVar229._12_4_;
    auVar250._16_4_ = fVar254 * auVar111._16_4_ + auVar260._16_4_ * auVar229._16_4_;
    auVar250._20_4_ = fVar255 * auVar111._20_4_ + auVar260._20_4_ * auVar229._20_4_;
    auVar250._24_4_ = fVar256 * auVar111._24_4_ + auVar260._24_4_ * auVar229._24_4_;
    auVar250._28_4_ = auVar13._28_4_ + auVar260._28_4_;
    auVar17 = vsubps_avx(auVar187,auVar82);
    auVar15 = vsubps_avx(auVar229,auVar111);
    local_138 = local_4c8 * auVar17._0_4_ * 3.0;
    fStack_134 = fStack_4c4 * auVar17._4_4_ * 3.0;
    auVar13._4_4_ = fStack_134;
    auVar13._0_4_ = local_138;
    fStack_130 = fStack_4c0 * auVar17._8_4_ * 3.0;
    auVar13._8_4_ = fStack_130;
    fStack_12c = fStack_4bc * auVar17._12_4_ * 3.0;
    auVar13._12_4_ = fStack_12c;
    fStack_128 = local_4c8 * auVar17._16_4_ * 3.0;
    auVar13._16_4_ = fStack_128;
    fStack_124 = fStack_4c4 * auVar17._20_4_ * 3.0;
    auVar13._20_4_ = fStack_124;
    fStack_120 = fStack_4c0 * auVar17._24_4_ * 3.0;
    auVar13._24_4_ = fStack_120;
    auVar13._28_4_ = auVar17._28_4_;
    local_158 = local_4c8 * auVar15._0_4_ * 3.0;
    fStack_154 = fStack_4c4 * auVar15._4_4_ * 3.0;
    auVar18._4_4_ = fStack_154;
    auVar18._0_4_ = local_158;
    fStack_150 = fStack_4c0 * auVar15._8_4_ * 3.0;
    auVar18._8_4_ = fStack_150;
    fStack_14c = fStack_4bc * auVar15._12_4_ * 3.0;
    auVar18._12_4_ = fStack_14c;
    fStack_148 = local_4c8 * auVar15._16_4_ * 3.0;
    auVar18._16_4_ = fStack_148;
    fStack_144 = fStack_4c4 * auVar15._20_4_ * 3.0;
    auVar18._20_4_ = fStack_144;
    fStack_140 = fStack_4c0 * auVar15._24_4_ * 3.0;
    auVar18._24_4_ = fStack_140;
    auVar18._28_4_ = auVar187._28_4_;
    auVar15 = vperm2f128_avx(auVar218,auVar218,1);
    auVar15 = vshufps_avx(auVar15,auVar218,0x30);
    auVar80 = vshufps_avx(auVar218,auVar15,0x29);
    auVar13 = vsubps_avx(auVar218,auVar13);
    auVar15 = vperm2f128_avx(auVar13,auVar13,1);
    auVar15 = vshufps_avx(auVar15,auVar13,0x30);
    auVar15 = vshufps_avx(auVar13,auVar15,0x29);
    auVar18 = vsubps_avx(auVar250,auVar18);
    auVar13 = vperm2f128_avx(auVar18,auVar18,1);
    auVar13 = vshufps_avx(auVar13,auVar18,0x30);
    auVar18 = vshufps_avx(auVar18,auVar13,0x29);
    auVar19 = vsubps_avx(auVar218,local_b8);
    auVar81 = vsubps_avx(auVar80,_local_3e8);
    fVar142 = auVar81._0_4_ + auVar19._0_4_;
    fVar188 = auVar81._4_4_ + auVar19._4_4_;
    fVar149 = auVar81._8_4_ + auVar19._8_4_;
    fVar189 = auVar81._12_4_ + auVar19._12_4_;
    fVar150 = auVar81._16_4_ + auVar19._16_4_;
    fVar190 = auVar81._20_4_ + auVar19._20_4_;
    fVar151 = auVar81._24_4_ + auVar19._24_4_;
    auVar13 = vperm2f128_avx(auVar148,auVar148,1);
    auVar13 = vshufps_avx(auVar13,auVar148,0x30);
    local_d8 = vshufps_avx(auVar148,auVar13,0x29);
    auVar13 = vperm2f128_avx(auVar250,auVar250,1);
    auVar13 = vshufps_avx(auVar13,auVar250,0x30);
    local_98 = vshufps_avx(auVar250,auVar13,0x29);
    auVar13 = vsubps_avx(auVar250,auVar148);
    auVar82 = vsubps_avx(local_98,local_d8);
    fVar192 = auVar82._0_4_ + auVar13._0_4_;
    fVar205 = auVar82._4_4_ + auVar13._4_4_;
    fVar206 = auVar82._8_4_ + auVar13._8_4_;
    fVar207 = auVar82._12_4_ + auVar13._12_4_;
    fVar85 = auVar82._16_4_ + auVar13._16_4_;
    fVar86 = auVar82._20_4_ + auVar13._20_4_;
    fVar87 = auVar82._24_4_ + auVar13._24_4_;
    auVar20._4_4_ = fVar188 * auVar148._4_4_;
    auVar20._0_4_ = fVar142 * auVar148._0_4_;
    auVar20._8_4_ = fVar149 * auVar148._8_4_;
    auVar20._12_4_ = fVar189 * auVar148._12_4_;
    auVar20._16_4_ = fVar150 * auVar148._16_4_;
    auVar20._20_4_ = fVar190 * auVar148._20_4_;
    auVar20._24_4_ = fVar151 * auVar148._24_4_;
    auVar20._28_4_ = auVar13._28_4_;
    auVar21._4_4_ = fVar205 * local_b8._4_4_;
    auVar21._0_4_ = fVar192 * local_b8._0_4_;
    auVar21._8_4_ = fVar206 * local_b8._8_4_;
    auVar21._12_4_ = fVar207 * local_b8._12_4_;
    auVar21._16_4_ = fVar85 * local_b8._16_4_;
    auVar21._20_4_ = fVar86 * local_b8._20_4_;
    auVar21._24_4_ = fVar87 * local_b8._24_4_;
    auVar21._28_4_ = fVar278;
    auVar20 = vsubps_avx(auVar20,auVar21);
    local_f8 = local_b8._0_4_ + local_f8;
    fStack_f4 = local_b8._4_4_ + fStack_f4;
    fStack_f0 = local_b8._8_4_ + fStack_f0;
    fStack_ec = local_b8._12_4_ + fStack_ec;
    fStack_e8 = local_b8._16_4_ + fStack_e8;
    fStack_e4 = local_b8._20_4_ + fStack_e4;
    fStack_e0 = local_b8._24_4_ + fStack_e0;
    fStack_dc = local_b8._28_4_ + auVar14._28_4_;
    local_118 = local_118 + auVar148._0_4_;
    fStack_114 = fStack_114 + auVar148._4_4_;
    fStack_110 = fStack_110 + auVar148._8_4_;
    fStack_10c = fStack_10c + auVar148._12_4_;
    fStack_108 = fStack_108 + auVar148._16_4_;
    fStack_104 = fStack_104 + auVar148._20_4_;
    fStack_100 = fStack_100 + auVar148._24_4_;
    fStack_fc = fVar281 + auVar148._28_4_;
    auVar14._4_4_ = fVar188 * fStack_114;
    auVar14._0_4_ = fVar142 * local_118;
    auVar14._8_4_ = fVar149 * fStack_110;
    auVar14._12_4_ = fVar189 * fStack_10c;
    auVar14._16_4_ = fVar150 * fStack_108;
    auVar14._20_4_ = fVar190 * fStack_104;
    auVar14._24_4_ = fVar151 * fStack_100;
    auVar14._28_4_ = fVar281;
    auVar22._4_4_ = fVar205 * fStack_f4;
    auVar22._0_4_ = fVar192 * local_f8;
    auVar22._8_4_ = fVar206 * fStack_f0;
    auVar22._12_4_ = fVar207 * fStack_ec;
    auVar22._16_4_ = fVar85 * fStack_e8;
    auVar22._20_4_ = fVar86 * fStack_e4;
    auVar22._24_4_ = fVar87 * fStack_e0;
    auVar22._28_4_ = fVar281 + auVar148._28_4_;
    auVar14 = vsubps_avx(auVar14,auVar22);
    local_538._0_4_ = auVar16._0_4_;
    local_538._4_4_ = auVar16._4_4_;
    fStack_530 = auVar16._8_4_;
    fStack_52c = auVar16._12_4_;
    fStack_528 = auVar16._16_4_;
    fStack_524 = auVar16._20_4_;
    fStack_520 = auVar16._24_4_;
    auVar23._4_4_ = fVar188 * (float)local_538._4_4_;
    auVar23._0_4_ = fVar142 * (float)local_538._0_4_;
    auVar23._8_4_ = fVar149 * fStack_530;
    auVar23._12_4_ = fVar189 * fStack_52c;
    auVar23._16_4_ = fVar150 * fStack_528;
    auVar23._20_4_ = fVar190 * fStack_524;
    auVar23._24_4_ = fVar151 * fStack_520;
    auVar23._28_4_ = fVar281;
    local_518 = auVar79._0_4_;
    fStack_514 = auVar79._4_4_;
    fStack_510 = auVar79._8_4_;
    fStack_50c = auVar79._12_4_;
    fStack_508 = auVar79._16_4_;
    fStack_504 = auVar79._20_4_;
    fStack_500 = auVar79._24_4_;
    auVar24._4_4_ = fVar205 * fStack_514;
    auVar24._0_4_ = fVar192 * local_518;
    auVar24._8_4_ = fVar206 * fStack_510;
    auVar24._12_4_ = fVar207 * fStack_50c;
    auVar24._16_4_ = fVar85 * fStack_508;
    auVar24._20_4_ = fVar86 * fStack_504;
    auVar24._24_4_ = fVar87 * fStack_500;
    auVar24._28_4_ = local_b8._28_4_;
    auVar21 = vsubps_avx(auVar23,auVar24);
    auVar25._4_4_ = local_d8._4_4_ * fVar188;
    auVar25._0_4_ = local_d8._0_4_ * fVar142;
    auVar25._8_4_ = local_d8._8_4_ * fVar149;
    auVar25._12_4_ = local_d8._12_4_ * fVar189;
    auVar25._16_4_ = local_d8._16_4_ * fVar150;
    auVar25._20_4_ = local_d8._20_4_ * fVar190;
    auVar25._24_4_ = local_d8._24_4_ * fVar151;
    auVar25._28_4_ = fVar281;
    auVar26._4_4_ = local_3e8._4_4_ * fVar205;
    auVar26._0_4_ = local_3e8._0_4_ * fVar192;
    auVar26._8_4_ = local_3e8._8_4_ * fVar206;
    auVar26._12_4_ = local_3e8._12_4_ * fVar207;
    auVar26._16_4_ = local_3e8._16_4_ * fVar85;
    auVar26._20_4_ = local_3e8._20_4_ * fVar86;
    auVar26._24_4_ = local_3e8._24_4_ * fVar87;
    auVar26._28_4_ = local_d8._28_4_;
    local_4c8 = auVar15._0_4_;
    fStack_4c4 = auVar15._4_4_;
    fStack_4c0 = auVar15._8_4_;
    fStack_4bc = auVar15._12_4_;
    fStack_4b8 = auVar15._16_4_;
    fStack_4b4 = auVar15._20_4_;
    fStack_4b0 = auVar15._24_4_;
    auVar22 = vsubps_avx(auVar25,auVar26);
    auVar27._4_4_ = auVar250._4_4_ * fVar188;
    auVar27._0_4_ = auVar250._0_4_ * fVar142;
    auVar27._8_4_ = auVar250._8_4_ * fVar149;
    auVar27._12_4_ = auVar250._12_4_ * fVar189;
    auVar27._16_4_ = auVar250._16_4_ * fVar150;
    auVar27._20_4_ = auVar250._20_4_ * fVar190;
    auVar27._24_4_ = auVar250._24_4_ * fVar151;
    auVar27._28_4_ = fVar281;
    auVar28._4_4_ = fVar205 * auVar218._4_4_;
    auVar28._0_4_ = fVar192 * auVar218._0_4_;
    auVar28._8_4_ = fVar206 * auVar218._8_4_;
    auVar28._12_4_ = fVar207 * auVar218._12_4_;
    auVar28._16_4_ = fVar85 * auVar218._16_4_;
    auVar28._20_4_ = fVar86 * auVar218._20_4_;
    auVar28._24_4_ = fVar87 * auVar218._24_4_;
    auVar28._28_4_ = fStack_dc;
    auVar23 = vsubps_avx(auVar27,auVar28);
    local_138 = auVar218._0_4_ + local_138;
    fStack_134 = auVar218._4_4_ + fStack_134;
    fStack_130 = auVar218._8_4_ + fStack_130;
    fStack_12c = auVar218._12_4_ + fStack_12c;
    fStack_128 = auVar218._16_4_ + fStack_128;
    fStack_124 = auVar218._20_4_ + fStack_124;
    fStack_120 = auVar218._24_4_ + fStack_120;
    fStack_11c = auVar218._28_4_ + auVar17._28_4_;
    local_158 = auVar250._0_4_ + local_158;
    fStack_154 = auVar250._4_4_ + fStack_154;
    fStack_150 = auVar250._8_4_ + fStack_150;
    fStack_14c = auVar250._12_4_ + fStack_14c;
    fStack_148 = auVar250._16_4_ + fStack_148;
    fStack_144 = auVar250._20_4_ + fStack_144;
    fStack_140 = auVar250._24_4_ + fStack_140;
    fStack_13c = auVar250._28_4_ + auVar187._28_4_;
    auVar17._4_4_ = fVar188 * fStack_154;
    auVar17._0_4_ = fVar142 * local_158;
    auVar17._8_4_ = fVar149 * fStack_150;
    auVar17._12_4_ = fVar189 * fStack_14c;
    auVar17._16_4_ = fVar150 * fStack_148;
    auVar17._20_4_ = fVar190 * fStack_144;
    auVar17._24_4_ = fVar151 * fStack_140;
    auVar17._28_4_ = auVar250._28_4_ + auVar187._28_4_;
    auVar29._4_4_ = fStack_134 * fVar205;
    auVar29._0_4_ = local_138 * fVar192;
    auVar29._8_4_ = fStack_130 * fVar206;
    auVar29._12_4_ = fStack_12c * fVar207;
    auVar29._16_4_ = fStack_128 * fVar85;
    auVar29._20_4_ = fStack_124 * fVar86;
    auVar29._24_4_ = fStack_120 * fVar87;
    auVar29._28_4_ = fStack_11c;
    auVar17 = vsubps_avx(auVar17,auVar29);
    auVar30._4_4_ = fVar188 * auVar18._4_4_;
    auVar30._0_4_ = fVar142 * auVar18._0_4_;
    auVar30._8_4_ = fVar149 * auVar18._8_4_;
    auVar30._12_4_ = fVar189 * auVar18._12_4_;
    auVar30._16_4_ = fVar150 * auVar18._16_4_;
    auVar30._20_4_ = fVar190 * auVar18._20_4_;
    auVar30._24_4_ = fVar151 * auVar18._24_4_;
    auVar30._28_4_ = fStack_11c;
    auVar31._4_4_ = fVar205 * fStack_4c4;
    auVar31._0_4_ = fVar192 * local_4c8;
    auVar31._8_4_ = fVar206 * fStack_4c0;
    auVar31._12_4_ = fVar207 * fStack_4bc;
    auVar31._16_4_ = fVar85 * fStack_4b8;
    auVar31._20_4_ = fVar86 * fStack_4b4;
    auVar31._24_4_ = fVar87 * fStack_4b0;
    auVar31._28_4_ = auVar18._28_4_;
    auVar24 = vsubps_avx(auVar30,auVar31);
    auVar32._4_4_ = fVar188 * local_98._4_4_;
    auVar32._0_4_ = fVar142 * local_98._0_4_;
    auVar32._8_4_ = fVar149 * local_98._8_4_;
    auVar32._12_4_ = fVar189 * local_98._12_4_;
    auVar32._16_4_ = fVar150 * local_98._16_4_;
    auVar32._20_4_ = fVar190 * local_98._20_4_;
    auVar32._24_4_ = fVar151 * local_98._24_4_;
    auVar32._28_4_ = auVar81._28_4_ + auVar19._28_4_;
    auVar19._4_4_ = auVar80._4_4_ * fVar205;
    auVar19._0_4_ = auVar80._0_4_ * fVar192;
    auVar19._8_4_ = auVar80._8_4_ * fVar206;
    auVar19._12_4_ = auVar80._12_4_ * fVar207;
    auVar19._16_4_ = auVar80._16_4_ * fVar85;
    auVar19._20_4_ = auVar80._20_4_ * fVar86;
    auVar19._24_4_ = auVar80._24_4_ * fVar87;
    auVar19._28_4_ = auVar82._28_4_ + auVar13._28_4_;
    auVar19 = vsubps_avx(auVar32,auVar19);
    auVar15 = vminps_avx(auVar20,auVar14);
    auVar79 = vmaxps_avx(auVar20,auVar14);
    auVar16 = vminps_avx(auVar21,auVar22);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar21,auVar22);
    auVar79 = vmaxps_avx(auVar79,auVar15);
    auVar13 = vminps_avx(auVar23,auVar17);
    auVar15 = vmaxps_avx(auVar23,auVar17);
    auVar14 = vminps_avx(auVar24,auVar19);
    auVar14 = vminps_avx(auVar13,auVar14);
    auVar14 = vminps_avx(auVar16,auVar14);
    auVar16 = vmaxps_avx(auVar24,auVar19);
    auVar15 = vmaxps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar79,auVar15);
    auVar79 = vcmpps_avx(auVar14,local_78,2);
    auVar15 = vcmpps_avx(auVar15,local_248,5);
    auVar79 = vandps_avx(auVar15,auVar79);
    auVar15 = local_178 & auVar79;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar15 = vsubps_avx(_local_3e8,local_b8);
      auVar16 = vsubps_avx(auVar80,auVar218);
      fVar188 = auVar15._0_4_ + auVar16._0_4_;
      fVar149 = auVar15._4_4_ + auVar16._4_4_;
      fVar189 = auVar15._8_4_ + auVar16._8_4_;
      fVar150 = auVar15._12_4_ + auVar16._12_4_;
      fVar190 = auVar15._16_4_ + auVar16._16_4_;
      fVar151 = auVar15._20_4_ + auVar16._20_4_;
      fVar192 = auVar15._24_4_ + auVar16._24_4_;
      auVar14 = vsubps_avx(local_d8,auVar148);
      auVar17 = vsubps_avx(local_98,auVar250);
      fVar205 = auVar14._0_4_ + auVar17._0_4_;
      fVar206 = auVar14._4_4_ + auVar17._4_4_;
      fVar207 = auVar14._8_4_ + auVar17._8_4_;
      fVar85 = auVar14._12_4_ + auVar17._12_4_;
      fVar86 = auVar14._16_4_ + auVar17._16_4_;
      fVar87 = auVar14._20_4_ + auVar17._20_4_;
      fVar88 = auVar14._24_4_ + auVar17._24_4_;
      fVar142 = auVar17._28_4_;
      auVar33._4_4_ = auVar148._4_4_ * fVar149;
      auVar33._0_4_ = auVar148._0_4_ * fVar188;
      auVar33._8_4_ = auVar148._8_4_ * fVar189;
      auVar33._12_4_ = auVar148._12_4_ * fVar150;
      auVar33._16_4_ = auVar148._16_4_ * fVar190;
      auVar33._20_4_ = auVar148._20_4_ * fVar151;
      auVar33._24_4_ = auVar148._24_4_ * fVar192;
      auVar33._28_4_ = auVar148._28_4_;
      auVar34._4_4_ = local_b8._4_4_ * fVar206;
      auVar34._0_4_ = local_b8._0_4_ * fVar205;
      auVar34._8_4_ = local_b8._8_4_ * fVar207;
      auVar34._12_4_ = local_b8._12_4_ * fVar85;
      auVar34._16_4_ = local_b8._16_4_ * fVar86;
      auVar34._20_4_ = local_b8._20_4_ * fVar87;
      auVar34._24_4_ = local_b8._24_4_ * fVar88;
      auVar34._28_4_ = local_b8._28_4_;
      auVar17 = vsubps_avx(auVar33,auVar34);
      auVar35._4_4_ = fVar149 * fStack_114;
      auVar35._0_4_ = fVar188 * local_118;
      auVar35._8_4_ = fVar189 * fStack_110;
      auVar35._12_4_ = fVar150 * fStack_10c;
      auVar35._16_4_ = fVar190 * fStack_108;
      auVar35._20_4_ = fVar151 * fStack_104;
      auVar35._24_4_ = fVar192 * fStack_100;
      auVar35._28_4_ = auVar148._28_4_;
      auVar36._4_4_ = fVar206 * fStack_f4;
      auVar36._0_4_ = fVar205 * local_f8;
      auVar36._8_4_ = fVar207 * fStack_f0;
      auVar36._12_4_ = fVar85 * fStack_ec;
      auVar36._16_4_ = fVar86 * fStack_e8;
      auVar36._20_4_ = fVar87 * fStack_e4;
      auVar36._24_4_ = fVar88 * fStack_e0;
      auVar36._28_4_ = fVar142;
      auVar19 = vsubps_avx(auVar35,auVar36);
      auVar37._4_4_ = fVar149 * (float)local_538._4_4_;
      auVar37._0_4_ = fVar188 * (float)local_538._0_4_;
      auVar37._8_4_ = fVar189 * fStack_530;
      auVar37._12_4_ = fVar150 * fStack_52c;
      auVar37._16_4_ = fVar190 * fStack_528;
      auVar37._20_4_ = fVar151 * fStack_524;
      auVar37._24_4_ = fVar192 * fStack_520;
      auVar37._28_4_ = fVar142;
      auVar38._4_4_ = fVar206 * fStack_514;
      auVar38._0_4_ = fVar205 * local_518;
      auVar38._8_4_ = fVar207 * fStack_510;
      auVar38._12_4_ = fVar85 * fStack_50c;
      auVar38._16_4_ = fVar86 * fStack_508;
      auVar38._20_4_ = fVar87 * fStack_504;
      auVar38._24_4_ = fVar88 * fStack_500;
      auVar38._28_4_ = auVar13._28_4_;
      auVar81 = vsubps_avx(auVar37,auVar38);
      auVar39._4_4_ = local_d8._4_4_ * fVar149;
      auVar39._0_4_ = local_d8._0_4_ * fVar188;
      auVar39._8_4_ = local_d8._8_4_ * fVar189;
      auVar39._12_4_ = local_d8._12_4_ * fVar150;
      auVar39._16_4_ = local_d8._16_4_ * fVar190;
      auVar39._20_4_ = local_d8._20_4_ * fVar151;
      auVar39._24_4_ = local_d8._24_4_ * fVar192;
      auVar39._28_4_ = auVar13._28_4_;
      auVar40._4_4_ = local_3e8._4_4_ * fVar206;
      auVar40._0_4_ = local_3e8._0_4_ * fVar205;
      auVar40._8_4_ = local_3e8._8_4_ * fVar207;
      auVar40._12_4_ = local_3e8._12_4_ * fVar85;
      auVar40._16_4_ = local_3e8._16_4_ * fVar86;
      auVar40._20_4_ = local_3e8._20_4_ * fVar87;
      uVar2 = local_3e8._28_4_;
      auVar40._24_4_ = local_3e8._24_4_ * fVar88;
      auVar40._28_4_ = uVar2;
      auVar82 = vsubps_avx(auVar39,auVar40);
      auVar41._4_4_ = auVar250._4_4_ * fVar149;
      auVar41._0_4_ = auVar250._0_4_ * fVar188;
      auVar41._8_4_ = auVar250._8_4_ * fVar189;
      auVar41._12_4_ = auVar250._12_4_ * fVar150;
      auVar41._16_4_ = auVar250._16_4_ * fVar190;
      auVar41._20_4_ = auVar250._20_4_ * fVar151;
      auVar41._24_4_ = auVar250._24_4_ * fVar192;
      auVar41._28_4_ = uVar2;
      auVar42._4_4_ = auVar218._4_4_ * fVar206;
      auVar42._0_4_ = auVar218._0_4_ * fVar205;
      auVar42._8_4_ = auVar218._8_4_ * fVar207;
      auVar42._12_4_ = auVar218._12_4_ * fVar85;
      auVar42._16_4_ = auVar218._16_4_ * fVar86;
      auVar42._20_4_ = auVar218._20_4_ * fVar87;
      auVar42._24_4_ = auVar218._24_4_ * fVar88;
      auVar42._28_4_ = auVar218._28_4_;
      auVar20 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = fVar149 * fStack_154;
      auVar43._0_4_ = fVar188 * local_158;
      auVar43._8_4_ = fVar189 * fStack_150;
      auVar43._12_4_ = fVar150 * fStack_14c;
      auVar43._16_4_ = fVar190 * fStack_148;
      auVar43._20_4_ = fVar151 * fStack_144;
      auVar43._24_4_ = fVar192 * fStack_140;
      auVar43._28_4_ = uVar2;
      auVar44._4_4_ = fVar206 * fStack_134;
      auVar44._0_4_ = fVar205 * local_138;
      auVar44._8_4_ = fVar207 * fStack_130;
      auVar44._12_4_ = fVar85 * fStack_12c;
      auVar44._16_4_ = fVar86 * fStack_128;
      auVar44._20_4_ = fVar87 * fStack_124;
      auVar44._24_4_ = fVar88 * fStack_120;
      auVar44._28_4_ = auVar250._28_4_;
      auVar21 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar149 * auVar18._4_4_;
      auVar45._0_4_ = fVar188 * auVar18._0_4_;
      auVar45._8_4_ = fVar189 * auVar18._8_4_;
      auVar45._12_4_ = fVar150 * auVar18._12_4_;
      auVar45._16_4_ = fVar190 * auVar18._16_4_;
      auVar45._20_4_ = fVar151 * auVar18._20_4_;
      auVar45._24_4_ = fVar192 * auVar18._24_4_;
      auVar45._28_4_ = auVar250._28_4_;
      auVar46._4_4_ = fStack_4c4 * fVar206;
      auVar46._0_4_ = local_4c8 * fVar205;
      auVar46._8_4_ = fStack_4c0 * fVar207;
      auVar46._12_4_ = fStack_4bc * fVar85;
      auVar46._16_4_ = fStack_4b8 * fVar86;
      auVar46._20_4_ = fStack_4b4 * fVar87;
      auVar46._24_4_ = fStack_4b0 * fVar88;
      auVar46._28_4_ = local_d8._28_4_;
      auVar18 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = local_98._4_4_ * fVar149;
      auVar47._0_4_ = local_98._0_4_ * fVar188;
      auVar47._8_4_ = local_98._8_4_ * fVar189;
      auVar47._12_4_ = local_98._12_4_ * fVar150;
      auVar47._16_4_ = local_98._16_4_ * fVar190;
      auVar47._20_4_ = local_98._20_4_ * fVar151;
      auVar47._24_4_ = local_98._24_4_ * fVar192;
      auVar47._28_4_ = auVar15._28_4_ + auVar16._28_4_;
      auVar48._4_4_ = auVar80._4_4_ * fVar206;
      auVar48._0_4_ = auVar80._0_4_ * fVar205;
      auVar48._8_4_ = auVar80._8_4_ * fVar207;
      auVar48._12_4_ = auVar80._12_4_ * fVar85;
      auVar48._16_4_ = auVar80._16_4_ * fVar86;
      auVar48._20_4_ = auVar80._20_4_ * fVar87;
      auVar48._24_4_ = auVar80._24_4_ * fVar88;
      auVar48._28_4_ = auVar14._28_4_ + fVar142;
      auVar22 = vsubps_avx(auVar47,auVar48);
      auVar16 = vminps_avx(auVar17,auVar19);
      auVar15 = vmaxps_avx(auVar17,auVar19);
      auVar13 = vminps_avx(auVar81,auVar82);
      auVar13 = vminps_avx(auVar16,auVar13);
      auVar16 = vmaxps_avx(auVar81,auVar82);
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar14 = vminps_avx(auVar20,auVar21);
      auVar16 = vmaxps_avx(auVar20,auVar21);
      auVar80 = vminps_avx(auVar18,auVar22);
      auVar14 = vminps_avx(auVar14,auVar80);
      auVar14 = vminps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(auVar18,auVar22);
      auVar16 = vmaxps_avx(auVar16,auVar13);
      auVar16 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vcmpps_avx(auVar14,local_78,2);
      auVar16 = vcmpps_avx(auVar16,local_248,5);
      auVar15 = vandps_avx(auVar16,auVar15);
      auVar79 = vandps_avx(local_178,auVar79);
      auVar16 = auVar79 & auVar15;
      if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar16 >> 0x7f,0) != '\0') ||
            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0xbf,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar16[0x1f] < '\0') {
        auVar79 = vandps_avx(auVar15,auVar79);
        uVar56 = vmovmskps_avx(auVar79);
        if (uVar56 != 0) {
          uVar54 = (ulong)uVar55;
          auStack_3c8[uVar54] = uVar56 & 0xff;
          uVar3 = vmovlps_avx(local_308);
          *(undefined8 *)(afStack_228 + uVar54 * 2) = uVar3;
          uVar57 = vmovlps_avx(auVar119);
          auStack_58[uVar54] = uVar57;
          uVar55 = uVar55 + 1;
        }
      }
    }
LAB_00e3b7a1:
    do {
      do {
        do {
          do {
            if (uVar55 == 0) {
              if (bVar58 != false) {
                return bVar58;
              }
              uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar78._4_4_ = uVar2;
              auVar78._0_4_ = uVar2;
              auVar78._8_4_ = uVar2;
              auVar78._12_4_ = uVar2;
              auVar67 = vcmpps_avx(local_318,auVar78,2);
              uVar52 = vmovmskps_avx(auVar67);
              uVar52 = (uint)uVar59 & uVar52;
              context = pRVar51;
              if (uVar52 == 0) {
                return false;
              }
              goto LAB_00e3a87c;
            }
            uVar54 = (ulong)(uVar55 - 1);
            uVar56 = auStack_3c8[uVar54];
            fVar142 = afStack_228[uVar54 * 2];
            fVar188 = afStack_228[uVar54 * 2 + 1];
            auVar198._8_8_ = 0;
            auVar198._0_8_ = auStack_58[uVar54];
            auVar204 = ZEXT1664(auVar198);
            uVar57 = 0;
            if (uVar56 != 0) {
              for (; (uVar56 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
              }
            }
            uVar56 = uVar56 - 1 & uVar56;
            auStack_3c8[uVar54] = uVar56;
            if (uVar56 == 0) {
              uVar55 = uVar55 - 1;
            }
            fVar189 = (float)(uVar57 + 1) * 0.14285715;
            fVar149 = (1.0 - (float)uVar57 * 0.14285715) * fVar142 +
                      fVar188 * (float)uVar57 * 0.14285715;
            fVar142 = (1.0 - fVar189) * fVar142 + fVar188 * fVar189;
            fVar188 = fVar142 - fVar149;
            if (0.16666667 <= fVar188) {
              auVar67 = vinsertps_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar142),0x10);
              auVar261 = ZEXT1664(auVar67);
              goto LAB_00e3b136;
            }
            auVar67 = vshufps_avx(auVar198,auVar198,0x50);
            auVar94._8_4_ = 0x3f800000;
            auVar94._0_8_ = 0x3f8000003f800000;
            auVar94._12_4_ = 0x3f800000;
            auVar241 = vsubps_avx(auVar94,auVar67);
            fVar192 = auVar67._0_4_;
            fVar205 = auVar67._4_4_;
            fVar206 = auVar67._8_4_;
            fVar207 = auVar67._12_4_;
            fVar189 = auVar241._0_4_;
            fVar150 = auVar241._4_4_;
            fVar190 = auVar241._8_4_;
            fVar151 = auVar241._12_4_;
            auVar124._0_4_ = fVar192 * auVar273._0_4_ + fVar89 * fVar189;
            auVar124._4_4_ = fVar205 * auVar273._4_4_ + fVar115 * fVar150;
            auVar124._8_4_ = fVar206 * auVar273._0_4_ + fVar89 * fVar190;
            auVar124._12_4_ = fVar207 * auVar273._4_4_ + fVar115 * fVar151;
            auVar157._0_4_ = auVar223._0_4_ * fVar192 + fVar90 * fVar189;
            auVar157._4_4_ = auVar223._4_4_ * fVar205 + fVar116 * fVar150;
            auVar157._8_4_ = auVar223._0_4_ * fVar206 + fVar90 * fVar190;
            auVar157._12_4_ = auVar223._4_4_ * fVar207 + fVar116 * fVar151;
            auVar179._0_4_ = auVar243._0_4_ * fVar192 + auVar290._0_4_ * fVar189;
            auVar179._4_4_ = auVar243._4_4_ * fVar205 + auVar290._4_4_ * fVar150;
            auVar179._8_4_ = auVar243._0_4_ * fVar206 + auVar290._0_4_ * fVar190;
            auVar179._12_4_ = auVar243._4_4_ * fVar207 + auVar290._4_4_ * fVar151;
            auVar64._0_4_ = auVar93._0_4_ * fVar192 + auVar285._0_4_ * fVar189;
            auVar64._4_4_ = auVar93._4_4_ * fVar205 + auVar285._4_4_ * fVar150;
            auVar64._8_4_ = auVar93._0_4_ * fVar206 + auVar285._0_4_ * fVar190;
            auVar64._12_4_ = auVar93._4_4_ * fVar207 + auVar285._4_4_ * fVar151;
            auVar112._16_16_ = auVar124;
            auVar112._0_16_ = auVar124;
            auVar140._16_16_ = auVar157;
            auVar140._0_16_ = auVar157;
            auVar169._16_16_ = auVar179;
            auVar169._0_16_ = auVar179;
            auVar79 = ZEXT2032(CONCAT416(fVar142,ZEXT416((uint)fVar149)));
            auVar79 = vshufps_avx(auVar79,auVar79,0);
            auVar15 = vsubps_avx(auVar140,auVar112);
            fVar189 = auVar79._0_4_;
            fVar150 = auVar79._4_4_;
            fVar190 = auVar79._8_4_;
            fVar151 = auVar79._12_4_;
            fVar192 = auVar79._16_4_;
            fVar205 = auVar79._20_4_;
            fVar206 = auVar79._24_4_;
            auVar113._0_4_ = auVar124._0_4_ + auVar15._0_4_ * fVar189;
            auVar113._4_4_ = auVar124._4_4_ + auVar15._4_4_ * fVar150;
            auVar113._8_4_ = auVar124._8_4_ + auVar15._8_4_ * fVar190;
            auVar113._12_4_ = auVar124._12_4_ + auVar15._12_4_ * fVar151;
            auVar113._16_4_ = auVar124._0_4_ + auVar15._16_4_ * fVar192;
            auVar113._20_4_ = auVar124._4_4_ + auVar15._20_4_ * fVar205;
            auVar113._24_4_ = auVar124._8_4_ + auVar15._24_4_ * fVar206;
            auVar113._28_4_ = auVar124._12_4_ + auVar15._28_4_;
            auVar79 = vsubps_avx(auVar169,auVar140);
            auVar141._0_4_ = auVar157._0_4_ + auVar79._0_4_ * fVar189;
            auVar141._4_4_ = auVar157._4_4_ + auVar79._4_4_ * fVar150;
            auVar141._8_4_ = auVar157._8_4_ + auVar79._8_4_ * fVar190;
            auVar141._12_4_ = auVar157._12_4_ + auVar79._12_4_ * fVar151;
            auVar141._16_4_ = auVar157._0_4_ + auVar79._16_4_ * fVar192;
            auVar141._20_4_ = auVar157._4_4_ + auVar79._20_4_ * fVar205;
            auVar141._24_4_ = auVar157._8_4_ + auVar79._24_4_ * fVar206;
            auVar141._28_4_ = auVar157._12_4_ + auVar79._28_4_;
            auVar67 = vsubps_avx(auVar64,auVar179);
            auVar83._0_4_ = auVar179._0_4_ + auVar67._0_4_ * fVar189;
            auVar83._4_4_ = auVar179._4_4_ + auVar67._4_4_ * fVar150;
            auVar83._8_4_ = auVar179._8_4_ + auVar67._8_4_ * fVar190;
            auVar83._12_4_ = auVar179._12_4_ + auVar67._12_4_ * fVar151;
            auVar83._16_4_ = auVar179._0_4_ + auVar67._0_4_ * fVar192;
            auVar83._20_4_ = auVar179._4_4_ + auVar67._4_4_ * fVar205;
            auVar83._24_4_ = auVar179._8_4_ + auVar67._8_4_ * fVar206;
            auVar83._28_4_ = auVar179._12_4_ + auVar67._12_4_;
            auVar79 = vsubps_avx(auVar141,auVar113);
            auVar114._0_4_ = auVar113._0_4_ + fVar189 * auVar79._0_4_;
            auVar114._4_4_ = auVar113._4_4_ + fVar150 * auVar79._4_4_;
            auVar114._8_4_ = auVar113._8_4_ + fVar190 * auVar79._8_4_;
            auVar114._12_4_ = auVar113._12_4_ + fVar151 * auVar79._12_4_;
            auVar114._16_4_ = auVar113._16_4_ + fVar192 * auVar79._16_4_;
            auVar114._20_4_ = auVar113._20_4_ + fVar205 * auVar79._20_4_;
            auVar114._24_4_ = auVar113._24_4_ + fVar206 * auVar79._24_4_;
            auVar114._28_4_ = auVar113._28_4_ + auVar79._28_4_;
            auVar79 = vsubps_avx(auVar83,auVar141);
            auVar84._0_4_ = auVar141._0_4_ + fVar189 * auVar79._0_4_;
            auVar84._4_4_ = auVar141._4_4_ + fVar150 * auVar79._4_4_;
            auVar84._8_4_ = auVar141._8_4_ + fVar190 * auVar79._8_4_;
            auVar84._12_4_ = auVar141._12_4_ + fVar151 * auVar79._12_4_;
            auVar84._16_4_ = auVar141._16_4_ + fVar192 * auVar79._16_4_;
            auVar84._20_4_ = auVar141._20_4_ + fVar205 * auVar79._20_4_;
            auVar84._24_4_ = auVar141._24_4_ + fVar206 * auVar79._24_4_;
            auVar84._28_4_ = auVar141._28_4_ + auVar79._28_4_;
            auVar79 = vsubps_avx(auVar84,auVar114);
            auVar199._0_4_ = auVar114._0_4_ + fVar189 * auVar79._0_4_;
            auVar199._4_4_ = auVar114._4_4_ + fVar150 * auVar79._4_4_;
            auVar199._8_4_ = auVar114._8_4_ + fVar190 * auVar79._8_4_;
            auVar199._12_4_ = auVar114._12_4_ + fVar151 * auVar79._12_4_;
            auVar203._16_4_ = auVar114._16_4_ + fVar192 * auVar79._16_4_;
            auVar203._0_16_ = auVar199;
            auVar203._20_4_ = auVar114._20_4_ + fVar205 * auVar79._20_4_;
            auVar203._24_4_ = auVar114._24_4_ + fVar206 * auVar79._24_4_;
            auVar203._28_4_ = auVar114._28_4_ + auVar141._28_4_;
            auVar91 = auVar203._16_16_;
            auVar96 = vshufps_avx(ZEXT416((uint)(fVar188 * 0.33333334)),
                                  ZEXT416((uint)(fVar188 * 0.33333334)),0);
            auVar180._0_4_ = auVar199._0_4_ + auVar96._0_4_ * auVar79._0_4_ * 3.0;
            auVar180._4_4_ = auVar199._4_4_ + auVar96._4_4_ * auVar79._4_4_ * 3.0;
            auVar180._8_4_ = auVar199._8_4_ + auVar96._8_4_ * auVar79._8_4_ * 3.0;
            auVar180._12_4_ = auVar199._12_4_ + auVar96._12_4_ * auVar79._12_4_ * 3.0;
            auVar137 = vshufpd_avx(auVar199,auVar199,3);
            auVar62 = vshufpd_avx(auVar91,auVar91,3);
            _local_3e8 = auVar137;
            auVar67 = vsubps_avx(auVar137,auVar199);
            auVar241 = vsubps_avx(auVar62,auVar91);
            auVar65._0_4_ = auVar67._0_4_ + auVar241._0_4_;
            auVar65._4_4_ = auVar67._4_4_ + auVar241._4_4_;
            auVar65._8_4_ = auVar67._8_4_ + auVar241._8_4_;
            auVar65._12_4_ = auVar67._12_4_ + auVar241._12_4_;
            auVar67 = vmovshdup_avx(auVar199);
            auVar241 = vmovshdup_avx(auVar180);
            auVar127 = vshufps_avx(auVar65,auVar65,0);
            auVar61 = vshufps_avx(auVar65,auVar65,0x55);
            fVar189 = auVar61._0_4_;
            fVar150 = auVar61._4_4_;
            fVar190 = auVar61._8_4_;
            fVar151 = auVar61._12_4_;
            fVar192 = auVar127._0_4_;
            fVar205 = auVar127._4_4_;
            fVar206 = auVar127._8_4_;
            fVar207 = auVar127._12_4_;
            auVar66._0_4_ = fVar192 * auVar199._0_4_ + auVar67._0_4_ * fVar189;
            auVar66._4_4_ = fVar205 * auVar199._4_4_ + auVar67._4_4_ * fVar150;
            auVar66._8_4_ = fVar206 * auVar199._8_4_ + auVar67._8_4_ * fVar190;
            auVar66._12_4_ = fVar207 * auVar199._12_4_ + auVar67._12_4_ * fVar151;
            auVar125._0_4_ = fVar192 * auVar180._0_4_ + auVar241._0_4_ * fVar189;
            auVar125._4_4_ = fVar205 * auVar180._4_4_ + auVar241._4_4_ * fVar150;
            auVar125._8_4_ = fVar206 * auVar180._8_4_ + auVar241._8_4_ * fVar190;
            auVar125._12_4_ = fVar207 * auVar180._12_4_ + auVar241._12_4_ * fVar151;
            auVar241 = vshufps_avx(auVar66,auVar66,0xe8);
            auVar127 = vshufps_avx(auVar125,auVar125,0xe8);
            auVar67 = vcmpps_avx(auVar241,auVar127,1);
            uVar56 = vextractps_avx(auVar67,0);
            auVar61 = auVar125;
            if ((uVar56 & 1) == 0) {
              auVar61 = auVar66;
            }
            auVar95._0_4_ = auVar96._0_4_ * auVar79._16_4_ * 3.0;
            auVar95._4_4_ = auVar96._4_4_ * auVar79._20_4_ * 3.0;
            auVar95._8_4_ = auVar96._8_4_ * auVar79._24_4_ * 3.0;
            auVar95._12_4_ = auVar96._12_4_ * 0.0;
            auVar117 = vsubps_avx(auVar91,auVar95);
            auVar96 = vmovshdup_avx(auVar117);
            auVar91 = vmovshdup_avx(auVar91);
            fVar85 = auVar117._0_4_;
            fVar86 = auVar117._4_4_;
            auVar158._0_4_ = fVar85 * fVar192 + auVar96._0_4_ * fVar189;
            auVar158._4_4_ = fVar86 * fVar205 + auVar96._4_4_ * fVar150;
            auVar158._8_4_ = auVar117._8_4_ * fVar206 + auVar96._8_4_ * fVar190;
            auVar158._12_4_ = auVar117._12_4_ * fVar207 + auVar96._12_4_ * fVar151;
            auVar181._0_4_ = fVar192 * auVar203._16_4_ + auVar91._0_4_ * fVar189;
            auVar181._4_4_ = fVar205 * auVar203._20_4_ + auVar91._4_4_ * fVar150;
            auVar181._8_4_ = fVar206 * auVar203._24_4_ + auVar91._8_4_ * fVar190;
            auVar181._12_4_ = fVar207 * auVar203._28_4_ + auVar91._12_4_ * fVar151;
            auVar91 = vshufps_avx(auVar158,auVar158,0xe8);
            auVar118 = vshufps_avx(auVar181,auVar181,0xe8);
            auVar96 = vcmpps_avx(auVar91,auVar118,1);
            uVar56 = vextractps_avx(auVar96,0);
            auVar119 = auVar181;
            if ((uVar56 & 1) == 0) {
              auVar119 = auVar158;
            }
            auVar61 = vmaxss_avx(auVar119,auVar61);
            auVar241 = vminps_avx(auVar241,auVar127);
            auVar127 = vminps_avx(auVar91,auVar118);
            auVar127 = vminps_avx(auVar241,auVar127);
            auVar67 = vshufps_avx(auVar67,auVar67,0x55);
            auVar67 = vblendps_avx(auVar67,auVar96,2);
            auVar96 = vpslld_avx(auVar67,0x1f);
            auVar67 = vshufpd_avx(auVar125,auVar125,1);
            auVar67 = vinsertps_avx(auVar67,auVar181,0x9c);
            auVar241 = vshufpd_avx(auVar66,auVar66,1);
            auVar241 = vinsertps_avx(auVar241,auVar158,0x9c);
            auVar67 = vblendvps_avx(auVar241,auVar67,auVar96);
            auVar241 = vmovshdup_avx(auVar67);
            auVar67 = vmaxss_avx(auVar241,auVar67);
            fVar190 = auVar127._0_4_;
            auVar241 = vmovshdup_avx(auVar127);
            fVar150 = auVar67._0_4_;
            fVar151 = auVar241._0_4_;
            fVar189 = auVar61._0_4_;
            if ((fVar190 < 0.0001) && (-0.0001 < fVar150)) break;
            if ((fVar151 < 0.0001 && -0.0001 < fVar189) || (fVar190 < 0.0001 && -0.0001 < fVar189))
            break;
            auVar96 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar67,1);
            auVar241 = vcmpps_avx(auVar241,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar241 = vandps_avx(auVar241,auVar96);
          } while ((auVar241 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar96 = vcmpps_avx(auVar127,_DAT_01f7aa10,1);
          auVar241 = vcmpss_avx(auVar61,ZEXT416(0),1);
          auVar126._8_4_ = 0x3f800000;
          auVar126._0_8_ = 0x3f8000003f800000;
          auVar126._12_4_ = 0x3f800000;
          auVar159._8_4_ = 0xbf800000;
          auVar159._0_8_ = 0xbf800000bf800000;
          auVar159._12_4_ = 0xbf800000;
          auVar241 = vblendvps_avx(auVar126,auVar159,auVar241);
          auVar96 = vblendvps_avx(auVar126,auVar159,auVar96);
          auVar127 = vcmpss_avx(auVar96,auVar241,4);
          auVar127 = vpshufd_avx(ZEXT416(auVar127._0_4_ & 1),0x50);
          auVar127 = vpslld_avx(auVar127,0x1f);
          auVar127 = vpsrad_avx(auVar127,0x1f);
          auVar127 = vpandn_avx(auVar127,_DAT_01fafeb0);
          auVar61 = vmovshdup_avx(auVar96);
          fVar192 = auVar61._0_4_;
          local_578._0_4_ = auVar10._0_4_;
          local_578._4_4_ = auVar10._4_4_;
          fStack_570 = auVar10._8_4_;
          fStack_56c = auVar10._12_4_;
          if ((auVar96._0_4_ != fVar192) || (NAN(auVar96._0_4_) || NAN(fVar192))) {
            if ((fVar151 != fVar190) || (NAN(fVar151) || NAN(fVar190))) {
              fVar190 = -fVar190 / (fVar151 - fVar190);
              auVar96 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar190) * 0.0 + fVar190)));
            }
            else {
              auVar96 = ZEXT816(0x3f80000000000000);
              if ((fVar190 != 0.0) || (NAN(fVar190))) {
                auVar96 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar91 = vcmpps_avx(auVar127,auVar96,1);
            auVar61 = vblendps_avx(auVar127,auVar96,2);
            auVar96 = vblendps_avx(auVar96,auVar127,2);
            auVar127 = vblendvps_avx(auVar96,auVar61,auVar91);
          }
          auVar67 = vcmpss_avx(auVar67,ZEXT416(0),1);
          auVar128._8_4_ = 0x3f800000;
          auVar128._0_8_ = 0x3f8000003f800000;
          auVar128._12_4_ = 0x3f800000;
          auVar160._8_4_ = 0xbf800000;
          auVar160._0_8_ = 0xbf800000bf800000;
          auVar160._12_4_ = 0xbf800000;
          auVar67 = vblendvps_avx(auVar128,auVar160,auVar67);
          fVar190 = auVar67._0_4_;
          if ((auVar241._0_4_ != fVar190) || (NAN(auVar241._0_4_) || NAN(fVar190))) {
            if ((fVar150 != fVar189) || (NAN(fVar150) || NAN(fVar189))) {
              fVar189 = -fVar189 / (fVar150 - fVar189);
              auVar67 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar189) * 0.0 + fVar189)));
            }
            else {
              auVar67 = ZEXT816(0x3f80000000000000);
              if ((fVar189 != 0.0) || (NAN(fVar189))) {
                auVar67 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar96 = vcmpps_avx(auVar127,auVar67,1);
            auVar241 = vblendps_avx(auVar127,auVar67,2);
            auVar67 = vblendps_avx(auVar67,auVar127,2);
            auVar127 = vblendvps_avx(auVar67,auVar241,auVar96);
          }
          if ((fVar192 != fVar190) || (NAN(fVar192) || NAN(fVar190))) {
            auVar68._8_4_ = 0x3f800000;
            auVar68._0_8_ = 0x3f8000003f800000;
            auVar68._12_4_ = 0x3f800000;
            auVar67 = vcmpps_avx(auVar127,auVar68,1);
            auVar241 = vinsertps_avx(auVar127,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar129._4_12_ = auVar127._4_12_;
            auVar129._0_4_ = 0x3f800000;
            auVar127 = vblendvps_avx(auVar129,auVar241,auVar67);
          }
          auVar67 = vcmpps_avx(auVar127,_DAT_01f7b6f0,1);
          auVar49._12_4_ = 0;
          auVar49._0_12_ = auVar127._4_12_;
          auVar241 = vinsertps_avx(auVar127,ZEXT416(0x3f800000),0x10);
          auVar67 = vblendvps_avx(auVar241,auVar49 << 0x20,auVar67);
          auVar241 = vmovshdup_avx(auVar67);
        } while (auVar241._0_4_ < auVar67._0_4_);
        auVar69._0_4_ = auVar67._0_4_ + -0.1;
        auVar69._4_4_ = auVar67._4_4_ + 0.1;
        auVar69._8_4_ = auVar67._8_4_ + 0.0;
        auVar69._12_4_ = auVar67._12_4_ + 0.0;
        auVar96 = vshufpd_avx(auVar180,auVar180,3);
        auVar200._8_8_ = 0x3f80000000000000;
        auVar200._0_8_ = 0x3f80000000000000;
        auVar67 = vcmpps_avx(auVar69,auVar200,1);
        auVar50._12_4_ = 0;
        auVar50._0_12_ = auVar69._4_12_;
        auVar241 = vinsertps_avx(auVar69,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar67 = vblendvps_avx(auVar241,auVar50 << 0x20,auVar67);
        auVar241 = vshufpd_avx(auVar117,auVar117,3);
        auVar127 = vshufps_avx(auVar67,auVar67,0x50);
        auVar201._8_4_ = 0x3f800000;
        auVar201._0_8_ = 0x3f8000003f800000;
        auVar201._12_4_ = 0x3f800000;
        auVar61 = vsubps_avx(auVar201,auVar127);
        local_3e8._0_4_ = auVar137._0_4_;
        local_3e8._4_4_ = auVar137._4_4_;
        fStack_3e0 = auVar137._8_4_;
        fStack_3dc = auVar137._12_4_;
        fVar189 = auVar127._0_4_;
        fVar150 = auVar127._4_4_;
        fVar190 = auVar127._8_4_;
        fVar151 = auVar127._12_4_;
        local_4f8 = auVar62._0_4_;
        fStack_4f4 = auVar62._4_4_;
        fStack_4f0 = auVar62._8_4_;
        fStack_4ec = auVar62._12_4_;
        fVar192 = auVar61._0_4_;
        fVar205 = auVar61._4_4_;
        fVar206 = auVar61._8_4_;
        fVar207 = auVar61._12_4_;
        auVar70._0_4_ = fVar189 * (float)local_3e8._0_4_ + fVar192 * auVar199._0_4_;
        auVar70._4_4_ = fVar150 * (float)local_3e8._4_4_ + fVar205 * auVar199._4_4_;
        auVar70._8_4_ = fVar190 * fStack_3e0 + fVar206 * auVar199._0_4_;
        auVar70._12_4_ = fVar151 * fStack_3dc + fVar207 * auVar199._4_4_;
        auVar130._0_4_ = fVar189 * auVar96._0_4_ + fVar192 * auVar180._0_4_;
        auVar130._4_4_ = fVar150 * auVar96._4_4_ + fVar205 * auVar180._4_4_;
        auVar130._8_4_ = fVar190 * auVar96._8_4_ + fVar206 * auVar180._0_4_;
        auVar130._12_4_ = fVar151 * auVar96._12_4_ + fVar207 * auVar180._4_4_;
        auVar182._0_4_ = fVar189 * auVar241._0_4_ + fVar192 * fVar85;
        auVar182._4_4_ = fVar150 * auVar241._4_4_ + fVar205 * fVar86;
        auVar182._8_4_ = fVar190 * auVar241._8_4_ + fVar206 * fVar85;
        auVar182._12_4_ = fVar151 * auVar241._12_4_ + fVar207 * fVar86;
        auVar217._0_4_ = fVar189 * local_4f8 + fVar192 * auVar203._16_4_;
        auVar217._4_4_ = fVar150 * fStack_4f4 + fVar205 * auVar203._20_4_;
        auVar217._8_4_ = fVar190 * fStack_4f0 + fVar206 * auVar203._16_4_;
        auVar217._12_4_ = fVar151 * fStack_4ec + fVar207 * auVar203._20_4_;
        auVar62 = vsubps_avx(auVar201,auVar67);
        auVar241 = vmovshdup_avx(auVar198);
        auVar137 = vmovsldup_avx(auVar198);
        auVar202._0_4_ = auVar137._0_4_ * auVar62._0_4_ + auVar67._0_4_ * auVar241._0_4_;
        auVar202._4_4_ = auVar137._4_4_ * auVar62._4_4_ + auVar67._4_4_ * auVar241._4_4_;
        auVar202._8_4_ = auVar137._8_4_ * auVar62._8_4_ + auVar67._8_4_ * auVar241._8_4_;
        auVar202._12_4_ = auVar137._12_4_ * auVar62._12_4_ + auVar67._12_4_ * auVar241._12_4_;
        auVar117 = vmovshdup_avx(auVar202);
        auVar67 = vsubps_avx(auVar130,auVar70);
        auVar146._0_4_ = auVar67._0_4_ * 3.0;
        auVar146._4_4_ = auVar67._4_4_ * 3.0;
        auVar146._8_4_ = auVar67._8_4_ * 3.0;
        auVar146._12_4_ = auVar67._12_4_ * 3.0;
        auVar67 = vsubps_avx(auVar182,auVar130);
        auVar224._0_4_ = auVar67._0_4_ * 3.0;
        auVar224._4_4_ = auVar67._4_4_ * 3.0;
        auVar224._8_4_ = auVar67._8_4_ * 3.0;
        auVar224._12_4_ = auVar67._12_4_ * 3.0;
        auVar67 = vsubps_avx(auVar217,auVar182);
        auVar244._0_4_ = auVar67._0_4_ * 3.0;
        auVar244._4_4_ = auVar67._4_4_ * 3.0;
        auVar244._8_4_ = auVar67._8_4_ * 3.0;
        auVar244._12_4_ = auVar67._12_4_ * 3.0;
        auVar241 = vminps_avx(auVar224,auVar244);
        auVar67 = vmaxps_avx(auVar224,auVar244);
        auVar241 = vminps_avx(auVar146,auVar241);
        auVar67 = vmaxps_avx(auVar146,auVar67);
        auVar137 = vshufpd_avx(auVar241,auVar241,3);
        auVar62 = vshufpd_avx(auVar67,auVar67,3);
        auVar241 = vminps_avx(auVar241,auVar137);
        auVar67 = vmaxps_avx(auVar67,auVar62);
        auVar137 = vshufps_avx(ZEXT416((uint)(1.0 / fVar188)),ZEXT416((uint)(1.0 / fVar188)),0);
        auVar225._0_4_ = auVar241._0_4_ * auVar137._0_4_;
        auVar225._4_4_ = auVar241._4_4_ * auVar137._4_4_;
        auVar225._8_4_ = auVar241._8_4_ * auVar137._8_4_;
        auVar225._12_4_ = auVar241._12_4_ * auVar137._12_4_;
        auVar245._0_4_ = auVar137._0_4_ * auVar67._0_4_;
        auVar245._4_4_ = auVar137._4_4_ * auVar67._4_4_;
        auVar245._8_4_ = auVar137._8_4_ * auVar67._8_4_;
        auVar245._12_4_ = auVar137._12_4_ * auVar67._12_4_;
        auVar61 = ZEXT416((uint)(1.0 / (auVar117._0_4_ - auVar202._0_4_)));
        auVar67 = vshufpd_avx(auVar70,auVar70,3);
        auVar241 = vshufpd_avx(auVar130,auVar130,3);
        auVar137 = vshufpd_avx(auVar182,auVar182,3);
        auVar62 = vshufpd_avx(auVar217,auVar217,3);
        auVar67 = vsubps_avx(auVar67,auVar70);
        auVar96 = vsubps_avx(auVar241,auVar130);
        auVar127 = vsubps_avx(auVar137,auVar182);
        auVar62 = vsubps_avx(auVar62,auVar217);
        auVar241 = vminps_avx(auVar67,auVar96);
        auVar67 = vmaxps_avx(auVar67,auVar96);
        auVar137 = vminps_avx(auVar127,auVar62);
        auVar137 = vminps_avx(auVar241,auVar137);
        auVar241 = vmaxps_avx(auVar127,auVar62);
        auVar67 = vmaxps_avx(auVar67,auVar241);
        auVar241 = vshufps_avx(auVar61,auVar61,0);
        auVar286._0_4_ = auVar241._0_4_ * auVar137._0_4_;
        auVar286._4_4_ = auVar241._4_4_ * auVar137._4_4_;
        auVar286._8_4_ = auVar241._8_4_ * auVar137._8_4_;
        auVar286._12_4_ = auVar241._12_4_ * auVar137._12_4_;
        auVar292._0_4_ = auVar241._0_4_ * auVar67._0_4_;
        auVar292._4_4_ = auVar241._4_4_ * auVar67._4_4_;
        auVar292._8_4_ = auVar241._8_4_ * auVar67._8_4_;
        auVar292._12_4_ = auVar241._12_4_ * auVar67._12_4_;
        auVar67 = vmovsldup_avx(auVar202);
        auVar258._4_12_ = auVar67._4_12_;
        auVar258._0_4_ = fVar149;
        auVar265._4_12_ = auVar202._4_12_;
        auVar265._0_4_ = fVar142;
        auVar147._0_4_ = (fVar149 + fVar142) * 0.5;
        auVar147._4_4_ = (auVar67._4_4_ + auVar202._4_4_) * 0.5;
        auVar147._8_4_ = (auVar67._8_4_ + auVar202._8_4_) * 0.5;
        auVar147._12_4_ = (auVar67._12_4_ + auVar202._12_4_) * 0.5;
        auVar67 = vshufps_avx(auVar147,auVar147,0);
        fVar189 = auVar67._0_4_;
        fVar150 = auVar67._4_4_;
        fVar190 = auVar67._8_4_;
        fVar151 = auVar67._12_4_;
        auVar97._0_4_ = (float)local_578._0_4_ + fVar189 * (float)local_258._0_4_;
        auVar97._4_4_ = (float)local_578._4_4_ + fVar150 * (float)local_258._4_4_;
        auVar97._8_4_ = fStack_570 + fVar190 * fStack_250;
        auVar97._12_4_ = fStack_56c + fVar151 * fStack_24c;
        local_568._0_4_ = auVar11._0_4_;
        local_568._4_4_ = auVar11._4_4_;
        fStack_560 = auVar11._8_4_;
        fStack_55c = auVar11._12_4_;
        auVar131._0_4_ = fVar189 * (float)local_268._0_4_ + (float)local_568._0_4_;
        auVar131._4_4_ = fVar150 * (float)local_268._4_4_ + (float)local_568._4_4_;
        auVar131._8_4_ = fVar190 * fStack_260 + fStack_560;
        auVar131._12_4_ = fVar151 * fStack_25c + fStack_55c;
        local_4a8 = auVar12._0_4_;
        fStack_4a4 = auVar12._4_4_;
        fStack_4a0 = auVar12._8_4_;
        fStack_49c = auVar12._12_4_;
        auVar183._0_4_ = fVar189 * (float)local_278._0_4_ + local_4a8;
        auVar183._4_4_ = fVar150 * (float)local_278._4_4_ + fStack_4a4;
        auVar183._8_4_ = fVar190 * fStack_270 + fStack_4a0;
        auVar183._12_4_ = fVar151 * fStack_26c + fStack_49c;
        auVar67 = vsubps_avx(auVar131,auVar97);
        auVar98._0_4_ = auVar97._0_4_ + fVar189 * auVar67._0_4_;
        auVar98._4_4_ = auVar97._4_4_ + fVar150 * auVar67._4_4_;
        auVar98._8_4_ = auVar97._8_4_ + fVar190 * auVar67._8_4_;
        auVar98._12_4_ = auVar97._12_4_ + fVar151 * auVar67._12_4_;
        auVar67 = vsubps_avx(auVar183,auVar131);
        auVar132._0_4_ = auVar131._0_4_ + fVar189 * auVar67._0_4_;
        auVar132._4_4_ = auVar131._4_4_ + fVar150 * auVar67._4_4_;
        auVar132._8_4_ = auVar131._8_4_ + fVar190 * auVar67._8_4_;
        auVar132._12_4_ = auVar131._12_4_ + fVar151 * auVar67._12_4_;
        auVar67 = vsubps_avx(auVar132,auVar98);
        fVar189 = auVar98._0_4_ + fVar189 * auVar67._0_4_;
        fVar150 = auVar98._4_4_ + fVar150 * auVar67._4_4_;
        auVar71._0_8_ = CONCAT44(fVar150,fVar189);
        auVar71._8_4_ = auVar98._8_4_ + fVar190 * auVar67._8_4_;
        auVar71._12_4_ = auVar98._12_4_ + fVar151 * auVar67._12_4_;
        fVar190 = auVar67._0_4_ * 3.0;
        fVar151 = auVar67._4_4_ * 3.0;
        auVar99._0_8_ = CONCAT44(fVar151,fVar190);
        auVar99._8_4_ = auVar67._8_4_ * 3.0;
        auVar99._12_4_ = auVar67._12_4_ * 3.0;
        auVar133._8_8_ = auVar71._0_8_;
        auVar133._0_8_ = auVar71._0_8_;
        auVar67 = vshufpd_avx(auVar71,auVar71,3);
        auVar241 = vshufps_avx(auVar147,auVar147,0x55);
        auVar127 = vsubps_avx(auVar67,auVar133);
        auVar274._0_4_ = auVar127._0_4_ * auVar241._0_4_ + fVar189;
        auVar274._4_4_ = auVar127._4_4_ * auVar241._4_4_ + fVar150;
        auVar274._8_4_ = auVar127._8_4_ * auVar241._8_4_ + fVar189;
        auVar274._12_4_ = auVar127._12_4_ * auVar241._12_4_ + fVar150;
        auVar134._8_8_ = auVar99._0_8_;
        auVar134._0_8_ = auVar99._0_8_;
        auVar67 = vshufpd_avx(auVar99,auVar99,1);
        auVar67 = vsubps_avx(auVar67,auVar134);
        auVar100._0_4_ = auVar67._0_4_ * auVar241._0_4_ + fVar190;
        auVar100._4_4_ = auVar67._4_4_ * auVar241._4_4_ + fVar151;
        auVar100._8_4_ = auVar67._8_4_ * auVar241._8_4_ + fVar190;
        auVar100._12_4_ = auVar67._12_4_ * auVar241._12_4_ + fVar151;
        auVar241 = vmovshdup_avx(auVar100);
        auVar184._0_8_ = auVar241._0_8_ ^ 0x8000000080000000;
        auVar184._8_4_ = auVar241._8_4_ ^ 0x80000000;
        auVar184._12_4_ = auVar241._12_4_ ^ 0x80000000;
        auVar137 = vmovshdup_avx(auVar127);
        auVar67 = vunpcklps_avx(auVar137,auVar184);
        auVar62 = vshufps_avx(auVar67,auVar184,4);
        auVar72._0_8_ = auVar127._0_8_ ^ 0x8000000080000000;
        auVar72._8_4_ = -auVar127._8_4_;
        auVar72._12_4_ = -auVar127._12_4_;
        auVar67 = vmovlhps_avx(auVar72,auVar100);
        auVar96 = vshufps_avx(auVar67,auVar100,8);
        auVar67 = ZEXT416((uint)(auVar100._0_4_ * auVar137._0_4_ - auVar127._0_4_ * auVar241._0_4_))
        ;
        auVar241 = vshufps_avx(auVar67,auVar67,0);
        auVar67 = vdivps_avx(auVar62,auVar241);
        auVar241 = vdivps_avx(auVar96,auVar241);
        auVar96 = vinsertps_avx(auVar225,auVar286,0x1c);
        auVar127 = vinsertps_avx(auVar245,auVar292,0x1c);
        auVar61 = vinsertps_avx(auVar286,auVar225,0x4c);
        auVar91 = vinsertps_avx(auVar292,auVar245,0x4c);
        auVar137 = vmovsldup_avx(auVar67);
        auVar246._0_4_ = auVar96._0_4_ * auVar137._0_4_;
        auVar246._4_4_ = auVar96._4_4_ * auVar137._4_4_;
        auVar246._8_4_ = auVar96._8_4_ * auVar137._8_4_;
        auVar246._12_4_ = auVar96._12_4_ * auVar137._12_4_;
        auVar101._0_4_ = auVar137._0_4_ * auVar127._0_4_;
        auVar101._4_4_ = auVar137._4_4_ * auVar127._4_4_;
        auVar101._8_4_ = auVar137._8_4_ * auVar127._8_4_;
        auVar101._12_4_ = auVar137._12_4_ * auVar127._12_4_;
        auVar62 = vminps_avx(auVar246,auVar101);
        auVar137 = vmaxps_avx(auVar101,auVar246);
        auVar118 = vmovsldup_avx(auVar241);
        auVar293._0_4_ = auVar118._0_4_ * auVar61._0_4_;
        auVar293._4_4_ = auVar118._4_4_ * auVar61._4_4_;
        auVar293._8_4_ = auVar118._8_4_ * auVar61._8_4_;
        auVar293._12_4_ = auVar118._12_4_ * auVar61._12_4_;
        auVar247._0_4_ = auVar118._0_4_ * auVar91._0_4_;
        auVar247._4_4_ = auVar118._4_4_ * auVar91._4_4_;
        auVar247._8_4_ = auVar118._8_4_ * auVar91._8_4_;
        auVar247._12_4_ = auVar118._12_4_ * auVar91._12_4_;
        auVar118 = vminps_avx(auVar293,auVar247);
        auVar161._0_4_ = auVar62._0_4_ + auVar118._0_4_;
        auVar161._4_4_ = auVar62._4_4_ + auVar118._4_4_;
        auVar161._8_4_ = auVar62._8_4_ + auVar118._8_4_;
        auVar161._12_4_ = auVar62._12_4_ + auVar118._12_4_;
        auVar62 = vmaxps_avx(auVar247,auVar293);
        auVar118 = vsubps_avx(auVar258,auVar147);
        auVar119 = vsubps_avx(auVar265,auVar147);
        auVar102._0_4_ = auVar62._0_4_ + auVar137._0_4_;
        auVar102._4_4_ = auVar62._4_4_ + auVar137._4_4_;
        auVar102._8_4_ = auVar62._8_4_ + auVar137._8_4_;
        auVar102._12_4_ = auVar62._12_4_ + auVar137._12_4_;
        auVar266._8_8_ = 0x3f800000;
        auVar266._0_8_ = 0x3f800000;
        auVar137 = vsubps_avx(auVar266,auVar102);
        auVar62 = vsubps_avx(auVar266,auVar161);
        fVar206 = auVar118._0_4_;
        auVar267._0_4_ = fVar206 * auVar137._0_4_;
        fVar207 = auVar118._4_4_;
        auVar267._4_4_ = fVar207 * auVar137._4_4_;
        fVar85 = auVar118._8_4_;
        auVar267._8_4_ = fVar85 * auVar137._8_4_;
        fVar86 = auVar118._12_4_;
        auVar267._12_4_ = fVar86 * auVar137._12_4_;
        fVar190 = auVar119._0_4_;
        auVar103._0_4_ = fVar190 * auVar137._0_4_;
        fVar151 = auVar119._4_4_;
        auVar103._4_4_ = fVar151 * auVar137._4_4_;
        fVar192 = auVar119._8_4_;
        auVar103._8_4_ = fVar192 * auVar137._8_4_;
        fVar205 = auVar119._12_4_;
        auVar103._12_4_ = fVar205 * auVar137._12_4_;
        auVar287._0_4_ = fVar206 * auVar62._0_4_;
        auVar287._4_4_ = fVar207 * auVar62._4_4_;
        auVar287._8_4_ = fVar85 * auVar62._8_4_;
        auVar287._12_4_ = fVar86 * auVar62._12_4_;
        auVar162._0_4_ = fVar190 * auVar62._0_4_;
        auVar162._4_4_ = fVar151 * auVar62._4_4_;
        auVar162._8_4_ = fVar192 * auVar62._8_4_;
        auVar162._12_4_ = fVar205 * auVar62._12_4_;
        auVar137 = vminps_avx(auVar267,auVar287);
        auVar62 = vminps_avx(auVar103,auVar162);
        auVar118 = vminps_avx(auVar137,auVar62);
        auVar137 = vmaxps_avx(auVar287,auVar267);
        auVar62 = vmaxps_avx(auVar162,auVar103);
        auVar119 = vshufps_avx(auVar147,auVar147,0x54);
        auVar62 = vmaxps_avx(auVar62,auVar137);
        auVar120 = vshufps_avx(auVar274,auVar274,0);
        auVar143 = vshufps_avx(auVar274,auVar274,0x55);
        auVar137 = vhaddps_avx(auVar118,auVar118);
        auVar62 = vhaddps_avx(auVar62,auVar62);
        auVar163._0_4_ = auVar143._0_4_ * auVar241._0_4_ + auVar120._0_4_ * auVar67._0_4_;
        auVar163._4_4_ = auVar143._4_4_ * auVar241._4_4_ + auVar120._4_4_ * auVar67._4_4_;
        auVar163._8_4_ = auVar143._8_4_ * auVar241._8_4_ + auVar120._8_4_ * auVar67._8_4_;
        auVar163._12_4_ = auVar143._12_4_ * auVar241._12_4_ + auVar120._12_4_ * auVar67._12_4_;
        auVar118 = vsubps_avx(auVar119,auVar163);
        fVar189 = auVar118._0_4_ + auVar137._0_4_;
        fVar150 = auVar118._0_4_ + auVar62._0_4_;
        auVar137 = vmaxss_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar189));
        auVar62 = vminss_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar142));
      } while (auVar62._0_4_ < auVar137._0_4_);
      auVar137 = vmovshdup_avx(auVar67);
      auVar164._0_4_ = auVar96._0_4_ * auVar137._0_4_;
      auVar164._4_4_ = auVar96._4_4_ * auVar137._4_4_;
      auVar164._8_4_ = auVar96._8_4_ * auVar137._8_4_;
      auVar164._12_4_ = auVar96._12_4_ * auVar137._12_4_;
      auVar104._0_4_ = auVar137._0_4_ * auVar127._0_4_;
      auVar104._4_4_ = auVar137._4_4_ * auVar127._4_4_;
      auVar104._8_4_ = auVar137._8_4_ * auVar127._8_4_;
      auVar104._12_4_ = auVar137._12_4_ * auVar127._12_4_;
      auVar62 = vminps_avx(auVar164,auVar104);
      auVar137 = vmaxps_avx(auVar104,auVar164);
      auVar96 = vmovshdup_avx(auVar241);
      auVar73._0_4_ = auVar96._0_4_ * auVar61._0_4_;
      auVar73._4_4_ = auVar96._4_4_ * auVar61._4_4_;
      auVar73._8_4_ = auVar96._8_4_ * auVar61._8_4_;
      auVar73._12_4_ = auVar96._12_4_ * auVar61._12_4_;
      auVar165._0_4_ = auVar91._0_4_ * auVar96._0_4_;
      auVar165._4_4_ = auVar91._4_4_ * auVar96._4_4_;
      auVar165._8_4_ = auVar91._8_4_ * auVar96._8_4_;
      auVar165._12_4_ = auVar91._12_4_ * auVar96._12_4_;
      auVar96 = vminps_avx(auVar73,auVar165);
      auVar135._0_4_ = auVar62._0_4_ + auVar96._0_4_;
      auVar135._4_4_ = auVar62._4_4_ + auVar96._4_4_;
      auVar135._8_4_ = auVar62._8_4_ + auVar96._8_4_;
      auVar135._12_4_ = auVar62._12_4_ + auVar96._12_4_;
      auVar62 = vmaxps_avx(auVar165,auVar73);
      auVar74._0_4_ = auVar137._0_4_ + auVar62._0_4_;
      auVar74._4_4_ = auVar137._4_4_ + auVar62._4_4_;
      auVar74._8_4_ = auVar137._8_4_ + auVar62._8_4_;
      auVar74._12_4_ = auVar137._12_4_ + auVar62._12_4_;
      auVar137 = vsubps_avx(auVar200,auVar74);
      auVar62 = vsubps_avx(auVar200,auVar135);
      auVar136._0_4_ = fVar206 * auVar137._0_4_;
      auVar136._4_4_ = fVar207 * auVar137._4_4_;
      auVar136._8_4_ = fVar85 * auVar137._8_4_;
      auVar136._12_4_ = fVar86 * auVar137._12_4_;
      auVar166._0_4_ = fVar206 * auVar62._0_4_;
      auVar166._4_4_ = fVar207 * auVar62._4_4_;
      auVar166._8_4_ = fVar85 * auVar62._8_4_;
      auVar166._12_4_ = fVar86 * auVar62._12_4_;
      auVar75._0_4_ = fVar190 * auVar137._0_4_;
      auVar75._4_4_ = fVar151 * auVar137._4_4_;
      auVar75._8_4_ = fVar192 * auVar137._8_4_;
      auVar75._12_4_ = fVar205 * auVar137._12_4_;
      auVar105._0_4_ = fVar190 * auVar62._0_4_;
      auVar105._4_4_ = fVar151 * auVar62._4_4_;
      auVar105._8_4_ = fVar192 * auVar62._8_4_;
      auVar105._12_4_ = fVar205 * auVar62._12_4_;
      auVar137 = vminps_avx(auVar136,auVar166);
      auVar62 = vminps_avx(auVar75,auVar105);
      auVar137 = vminps_avx(auVar137,auVar62);
      auVar62 = vmaxps_avx(auVar166,auVar136);
      auVar96 = vmaxps_avx(auVar105,auVar75);
      auVar137 = vhaddps_avx(auVar137,auVar137);
      auVar62 = vmaxps_avx(auVar96,auVar62);
      auVar62 = vhaddps_avx(auVar62,auVar62);
      auVar96 = vmovshdup_avx(auVar118);
      auVar204 = ZEXT1664(auVar202);
      auVar127 = ZEXT416((uint)(auVar96._0_4_ + auVar137._0_4_));
      auVar137 = vmaxss_avx(auVar202,auVar127);
      auVar96 = ZEXT416((uint)(auVar96._0_4_ + auVar62._0_4_));
      auVar62 = vminss_avx(auVar96,auVar117);
      auVar226._8_4_ = 0x7fffffff;
      auVar226._0_8_ = 0x7fffffff7fffffff;
      auVar226._12_4_ = 0x7fffffff;
    } while (auVar62._0_4_ < auVar137._0_4_);
    uVar56 = 0;
    if ((fVar149 < fVar189) && (fVar150 < fVar142)) {
      auVar137 = vcmpps_avx(auVar96,auVar117,1);
      auVar62 = vcmpps_avx(auVar202,auVar127,1);
      auVar137 = vandps_avx(auVar62,auVar137);
      uVar56 = auVar137._0_4_;
    }
    if ((3 < uVar55 || fVar188 < 0.001) || (uVar56 & 1) != 0) {
      lVar53 = 200;
      do {
        fVar188 = auVar118._0_4_;
        fVar142 = 1.0 - fVar188;
        auVar137 = ZEXT416((uint)(fVar142 * fVar142 * fVar142));
        auVar137 = vshufps_avx(auVar137,auVar137,0);
        auVar62 = ZEXT416((uint)(fVar188 * 3.0 * fVar142 * fVar142));
        auVar62 = vshufps_avx(auVar62,auVar62,0);
        auVar96 = ZEXT416((uint)(fVar142 * fVar188 * fVar188 * 3.0));
        auVar96 = vshufps_avx(auVar96,auVar96,0);
        auVar127 = ZEXT416((uint)(fVar188 * fVar188 * fVar188));
        auVar127 = vshufps_avx(auVar127,auVar127,0);
        fVar142 = (float)local_578._0_4_ * auVar137._0_4_ +
                  (float)local_568._0_4_ * auVar62._0_4_ +
                  (float)local_3f8._0_4_ * auVar127._0_4_ + local_4a8 * auVar96._0_4_;
        fVar188 = (float)local_578._4_4_ * auVar137._4_4_ +
                  (float)local_568._4_4_ * auVar62._4_4_ +
                  (float)local_3f8._4_4_ * auVar127._4_4_ + fStack_4a4 * auVar96._4_4_;
        auVar76._0_8_ = CONCAT44(fVar188,fVar142);
        auVar76._8_4_ =
             fStack_570 * auVar137._8_4_ +
             fStack_560 * auVar62._8_4_ + fStack_3f0 * auVar127._8_4_ + fStack_4a0 * auVar96._8_4_;
        auVar76._12_4_ =
             fStack_56c * auVar137._12_4_ +
             fStack_55c * auVar62._12_4_ +
             fStack_3ec * auVar127._12_4_ + fStack_49c * auVar96._12_4_;
        auVar106._8_8_ = auVar76._0_8_;
        auVar106._0_8_ = auVar76._0_8_;
        auVar62 = vshufpd_avx(auVar76,auVar76,1);
        auVar137 = vmovshdup_avx(auVar118);
        auVar62 = vsubps_avx(auVar62,auVar106);
        auVar77._0_4_ = auVar137._0_4_ * auVar62._0_4_ + fVar142;
        auVar77._4_4_ = auVar137._4_4_ * auVar62._4_4_ + fVar188;
        auVar77._8_4_ = auVar137._8_4_ * auVar62._8_4_ + fVar142;
        auVar77._12_4_ = auVar137._12_4_ * auVar62._12_4_ + fVar188;
        auVar137 = vshufps_avx(auVar77,auVar77,0);
        auVar62 = vshufps_avx(auVar77,auVar77,0x55);
        auVar107._0_4_ = auVar67._0_4_ * auVar137._0_4_ + auVar241._0_4_ * auVar62._0_4_;
        auVar107._4_4_ = auVar67._4_4_ * auVar137._4_4_ + auVar241._4_4_ * auVar62._4_4_;
        auVar107._8_4_ = auVar67._8_4_ * auVar137._8_4_ + auVar241._8_4_ * auVar62._8_4_;
        auVar107._12_4_ = auVar67._12_4_ * auVar137._12_4_ + auVar241._12_4_ * auVar62._12_4_;
        auVar118 = vsubps_avx(auVar118,auVar107);
        auVar137 = vandps_avx(auVar226,auVar77);
        auVar62 = vshufps_avx(auVar137,auVar137,0xf5);
        auVar137 = vmaxss_avx(auVar62,auVar137);
        if (auVar137._0_4_ < (float)local_408._0_4_) {
          fVar142 = auVar118._0_4_;
          if ((0.0 <= fVar142) && (fVar142 <= 1.0)) {
            auVar67 = vmovshdup_avx(auVar118);
            fVar188 = auVar67._0_4_;
            if ((0.0 <= fVar188) && (fVar188 <= 1.0)) {
              auVar67 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar91 = vinsertps_avx(auVar67,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar67 = vdpps_avx(auVar91,local_288,0x7f);
              auVar241 = vdpps_avx(auVar91,local_298,0x7f);
              auVar137 = vdpps_avx(auVar91,local_2c8,0x7f);
              auVar62 = vdpps_avx(auVar91,local_2d8,0x7f);
              auVar96 = vdpps_avx(auVar91,local_2e8,0x7f);
              auVar127 = vdpps_avx(auVar91,local_2f8,0x7f);
              fVar151 = 1.0 - fVar188;
              auVar61 = vdpps_avx(auVar91,local_2a8,0x7f);
              auVar91 = vdpps_avx(auVar91,local_2b8,0x7f);
              fVar192 = 1.0 - fVar142;
              fVar149 = auVar118._4_4_;
              fVar189 = auVar118._8_4_;
              fVar150 = auVar118._12_4_;
              fVar190 = fVar192 * fVar142 * fVar142 * 3.0;
              auVar185._0_4_ = fVar142 * fVar142 * fVar142;
              auVar185._4_4_ = fVar149 * fVar149 * fVar149;
              auVar185._8_4_ = fVar189 * fVar189 * fVar189;
              auVar185._12_4_ = fVar150 * fVar150 * fVar150;
              fVar149 = fVar142 * 3.0 * fVar192 * fVar192;
              fVar189 = fVar192 * fVar192 * fVar192;
              fVar142 = (fVar151 * auVar67._0_4_ + fVar188 * auVar137._0_4_) * fVar189 +
                        (fVar151 * auVar241._0_4_ + fVar188 * auVar62._0_4_) * fVar149 +
                        fVar190 * (fVar151 * auVar61._0_4_ + fVar188 * auVar96._0_4_) +
                        auVar185._0_4_ * (auVar127._0_4_ * fVar188 + fVar151 * auVar91._0_4_);
              if ((fVar171 <= fVar142) &&
                 (fVar188 = *(float *)(ray + k * 4 + 0x80), fVar142 <= fVar188)) {
                pGVar5 = (pRVar51->scene->geometries).items[uVar52].ptr;
                if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar60 = false;
                }
                else if ((pRVar51->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar60 = true, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_1c8 = vshufps_avx(auVar118,auVar118,0x55);
                  auVar227._8_4_ = 0x3f800000;
                  auVar227._0_8_ = 0x3f8000003f800000;
                  auVar227._12_4_ = 0x3f800000;
                  auVar67 = vsubps_avx(auVar227,local_1c8);
                  fVar150 = local_1c8._0_4_;
                  fVar151 = local_1c8._4_4_;
                  fVar205 = local_1c8._8_4_;
                  fVar206 = local_1c8._12_4_;
                  fVar207 = auVar67._0_4_;
                  fVar85 = auVar67._4_4_;
                  fVar86 = auVar67._8_4_;
                  fVar87 = auVar67._12_4_;
                  auVar248._0_4_ =
                       fVar150 * (float)local_428._0_4_ + fVar207 * (float)local_418._0_4_;
                  auVar248._4_4_ =
                       fVar151 * (float)local_428._4_4_ + fVar85 * (float)local_418._4_4_;
                  auVar248._8_4_ = fVar205 * fStack_420 + fVar86 * fStack_410;
                  auVar248._12_4_ = fVar206 * fStack_41c + fVar87 * fStack_40c;
                  auVar259._0_4_ =
                       fVar150 * (float)local_478._0_4_ + fVar207 * (float)local_458._0_4_;
                  auVar259._4_4_ =
                       fVar151 * (float)local_478._4_4_ + fVar85 * (float)local_458._4_4_;
                  auVar259._8_4_ = fVar205 * fStack_470 + fVar86 * fStack_450;
                  auVar259._12_4_ = fVar206 * fStack_46c + fVar87 * fStack_44c;
                  auVar268._0_4_ =
                       fVar150 * (float)local_328._0_4_ + fVar207 * (float)local_468._0_4_;
                  auVar268._4_4_ =
                       fVar151 * (float)local_328._4_4_ + fVar85 * (float)local_468._4_4_;
                  auVar268._8_4_ = fVar205 * fStack_320 + fVar86 * fStack_460;
                  auVar268._12_4_ = fVar206 * fStack_31c + fVar87 * fStack_45c;
                  auVar228._0_4_ =
                       fVar150 * (float)local_448._0_4_ + fVar207 * (float)local_438._0_4_;
                  auVar228._4_4_ =
                       fVar151 * (float)local_448._4_4_ + fVar85 * (float)local_438._4_4_;
                  auVar228._8_4_ = fVar205 * fStack_440 + fVar86 * fStack_430;
                  auVar228._12_4_ = fVar206 * fStack_43c + fVar87 * fStack_42c;
                  auVar62 = vsubps_avx(auVar259,auVar248);
                  auVar96 = vsubps_avx(auVar268,auVar259);
                  auVar127 = vsubps_avx(auVar228,auVar268);
                  local_1d8 = vshufps_avx(auVar118,auVar118,0);
                  fVar150 = local_1d8._0_4_;
                  fVar205 = local_1d8._4_4_;
                  fVar206 = local_1d8._8_4_;
                  fVar85 = local_1d8._12_4_;
                  auVar67 = vshufps_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),0);
                  fVar151 = auVar67._0_4_;
                  fVar192 = auVar67._4_4_;
                  fVar207 = auVar67._8_4_;
                  fVar86 = auVar67._12_4_;
                  auVar67 = vshufps_avx(auVar185,auVar185,0);
                  auVar241 = vshufps_avx(ZEXT416((uint)fVar190),ZEXT416((uint)fVar190),0);
                  auVar137 = vshufps_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149),0);
                  auVar167._0_4_ =
                       ((auVar96._0_4_ * fVar151 + auVar127._0_4_ * fVar150) * fVar150 +
                       (auVar62._0_4_ * fVar151 + auVar96._0_4_ * fVar150) * fVar151) * 3.0;
                  auVar167._4_4_ =
                       ((auVar96._4_4_ * fVar192 + auVar127._4_4_ * fVar205) * fVar205 +
                       (auVar62._4_4_ * fVar192 + auVar96._4_4_ * fVar205) * fVar192) * 3.0;
                  auVar167._8_4_ =
                       ((auVar96._8_4_ * fVar207 + auVar127._8_4_ * fVar206) * fVar206 +
                       (auVar62._8_4_ * fVar207 + auVar96._8_4_ * fVar206) * fVar207) * 3.0;
                  auVar167._12_4_ =
                       ((auVar96._12_4_ * fVar86 + auVar127._12_4_ * fVar85) * fVar85 +
                       (auVar62._12_4_ * fVar86 + auVar96._12_4_ * fVar85) * fVar86) * 3.0;
                  auVar62 = vshufps_avx(ZEXT416((uint)fVar189),ZEXT416((uint)fVar189),0);
                  auVar108._0_4_ =
                       auVar62._0_4_ * (float)local_358._0_4_ +
                       auVar137._0_4_ * (float)local_368._0_4_ +
                       auVar67._0_4_ * (float)local_388._0_4_ +
                       auVar241._0_4_ * (float)local_378._0_4_;
                  auVar108._4_4_ =
                       auVar62._4_4_ * (float)local_358._4_4_ +
                       auVar137._4_4_ * (float)local_368._4_4_ +
                       auVar67._4_4_ * (float)local_388._4_4_ +
                       auVar241._4_4_ * (float)local_378._4_4_;
                  auVar108._8_4_ =
                       auVar62._8_4_ * fStack_350 +
                       auVar137._8_4_ * fStack_360 +
                       auVar67._8_4_ * fStack_380 + auVar241._8_4_ * fStack_370;
                  auVar108._12_4_ =
                       auVar62._12_4_ * fStack_34c +
                       auVar137._12_4_ * fStack_35c +
                       auVar67._12_4_ * fStack_37c + auVar241._12_4_ * fStack_36c;
                  auVar67 = vshufps_avx(auVar167,auVar167,0xc9);
                  auVar138._0_4_ = auVar108._0_4_ * auVar67._0_4_;
                  auVar138._4_4_ = auVar108._4_4_ * auVar67._4_4_;
                  auVar138._8_4_ = auVar108._8_4_ * auVar67._8_4_;
                  auVar138._12_4_ = auVar108._12_4_ * auVar67._12_4_;
                  auVar67 = vshufps_avx(auVar108,auVar108,0xc9);
                  auVar109._0_4_ = auVar167._0_4_ * auVar67._0_4_;
                  auVar109._4_4_ = auVar167._4_4_ * auVar67._4_4_;
                  auVar109._8_4_ = auVar167._8_4_ * auVar67._8_4_;
                  auVar109._12_4_ = auVar167._12_4_ * auVar67._12_4_;
                  auVar241 = vsubps_avx(auVar109,auVar138);
                  auVar67 = vshufps_avx(auVar241,auVar241,0x55);
                  local_208[0] = (RTCHitN)auVar67[0];
                  local_208[1] = (RTCHitN)auVar67[1];
                  local_208[2] = (RTCHitN)auVar67[2];
                  local_208[3] = (RTCHitN)auVar67[3];
                  local_208[4] = (RTCHitN)auVar67[4];
                  local_208[5] = (RTCHitN)auVar67[5];
                  local_208[6] = (RTCHitN)auVar67[6];
                  local_208[7] = (RTCHitN)auVar67[7];
                  local_208[8] = (RTCHitN)auVar67[8];
                  local_208[9] = (RTCHitN)auVar67[9];
                  local_208[10] = (RTCHitN)auVar67[10];
                  local_208[0xb] = (RTCHitN)auVar67[0xb];
                  local_208[0xc] = (RTCHitN)auVar67[0xc];
                  local_208[0xd] = (RTCHitN)auVar67[0xd];
                  local_208[0xe] = (RTCHitN)auVar67[0xe];
                  local_208[0xf] = (RTCHitN)auVar67[0xf];
                  local_1f8 = vshufps_avx(auVar241,auVar241,0xaa);
                  local_1e8 = vshufps_avx(auVar241,auVar241,0);
                  local_1b8 = local_348._0_8_;
                  uStack_1b0 = local_348._8_8_;
                  local_1a8 = local_338._0_8_;
                  uStack_1a0 = local_338._8_8_;
                  vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                  uStack_194 = pRVar51->user->instID[0];
                  local_198 = uStack_194;
                  uStack_190 = uStack_194;
                  uStack_18c = uStack_194;
                  uStack_188 = pRVar51->user->instPrimID[0];
                  uStack_184 = uStack_188;
                  uStack_180 = uStack_188;
                  uStack_17c = uStack_188;
                  *(float *)(ray + k * 4 + 0x80) = fVar142;
                  local_498 = *local_488;
                  local_3b8.valid = (int *)local_498;
                  local_3b8.geometryUserPtr = pGVar5->userPtr;
                  local_3b8.context = pRVar51->user;
                  local_3b8.ray = (RTCRayN *)ray;
                  local_3b8.hit = local_208;
                  local_3b8.N = 4;
                  if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar5->occlusionFilterN)(&local_3b8);
                  }
                  if (local_498 == (undefined1  [16])0x0) {
                    auVar67 = vpcmpeqd_avx((undefined1  [16])0x0,ZEXT816(0));
                    auVar67 = auVar67 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var6 = pRVar51->args->filter;
                    auVar67 = ZEXT816(0);
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((pRVar51->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var6)(&local_3b8);
                      auVar67 = ZEXT816(0) << 0x40;
                    }
                    auVar241 = vpcmpeqd_avx(local_498,auVar67);
                    auVar67 = auVar241 ^ _DAT_01f7ae20;
                    auVar139._8_4_ = 0xff800000;
                    auVar139._0_8_ = 0xff800000ff800000;
                    auVar139._12_4_ = 0xff800000;
                    auVar241 = vblendvps_avx(auVar139,*(undefined1 (*) [16])(local_3b8.ray + 0x80),
                                             auVar241);
                    *(undefined1 (*) [16])(local_3b8.ray + 0x80) = auVar241;
                  }
                  auVar110._8_8_ = 0x100000001;
                  auVar110._0_8_ = 0x100000001;
                  bVar60 = (auVar110 & auVar67) != (undefined1  [16])0x0;
                  if (!bVar60) {
                    *(float *)(ray + k * 4 + 0x80) = fVar188;
                  }
                }
                bVar58 = (bool)(bVar58 | bVar60);
              }
            }
          }
          break;
        }
        lVar53 = lVar53 + -1;
      } while (lVar53 != 0);
      goto LAB_00e3b7a1;
    }
    auVar67 = vinsertps_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar142),0x10);
    auVar261 = ZEXT1664(auVar67);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }